

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  int iVar57;
  uint uVar58;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  byte bVar63;
  uint uVar64;
  long lVar65;
  ulong uVar66;
  uint uVar67;
  long lVar68;
  undefined4 uVar69;
  float fVar70;
  float fVar71;
  float fVar100;
  vint4 ai;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar101;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar102;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar103;
  undefined8 uVar104;
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar146;
  float fVar147;
  float fVar167;
  float fVar168;
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar169;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar184;
  vint4 bi;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar185;
  float fVar200;
  vint4 ai_1;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar201;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  vint4 ai_2;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  float fVar220;
  float fVar234;
  float fVar236;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar238;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar235;
  float fVar237;
  float fVar239;
  undefined1 auVar233 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar246 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  float fVar279;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar289 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar285;
  float fVar298;
  float fVar299;
  undefined1 auVar286 [16];
  float fVar300;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  __m128 a;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar317 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar330 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  RTCFilterFunctionNArguments local_570;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  uint local_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  undefined1 local_4c0 [16];
  uint auStack_4b0 [4];
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar62;
  undefined1 auVar329 [32];
  
  local_780[0] = prim[1];
  uVar60 = (ulong)(byte)local_780[0];
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  lVar65 = uVar60 * 0x25;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)local_780[0] * 0x10 + 6)));
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x11 + 6)));
  auVar171 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar23 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar65 + 6));
  fVar70 = *(float *)(prim + lVar65 + 0x12);
  fVar103 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar65 + 0x16)) *
            *(float *)(prim + lVar65 + 0x1a);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar243._0_4_ = fVar70 * auVar23._0_4_;
  auVar243._4_4_ = fVar70 * auVar23._4_4_;
  auVar243._8_4_ = fVar70 * auVar23._8_4_;
  auVar243._12_4_ = fVar70 * auVar23._12_4_;
  auVar105._0_4_ = fVar70 * auVar15._0_4_;
  auVar105._4_4_ = fVar70 * auVar15._4_4_;
  auVar105._8_4_ = fVar70 * auVar15._8_4_;
  auVar105._12_4_ = fVar70 * auVar15._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar174);
  auVar174 = vcvtdq2ps_avx(auVar22);
  auVar22 = vcvtdq2ps_avx(auVar269);
  auVar269 = vshufps_avx(auVar105,auVar105,0x55);
  auVar23 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar70 = auVar23._0_4_;
  auVar254._0_4_ = fVar70 * auVar18._0_4_;
  fVar100 = auVar23._4_4_;
  auVar254._4_4_ = fVar100 * auVar18._4_4_;
  fVar71 = auVar23._8_4_;
  auVar254._8_4_ = fVar71 * auVar18._8_4_;
  fVar101 = auVar23._12_4_;
  auVar254._12_4_ = fVar101 * auVar18._12_4_;
  auVar221._0_4_ = fVar70 * auVar21._0_4_;
  auVar221._4_4_ = fVar100 * auVar21._4_4_;
  auVar221._8_4_ = fVar71 * auVar21._8_4_;
  auVar221._12_4_ = fVar101 * auVar21._12_4_;
  auVar202._0_4_ = auVar22._0_4_ * fVar70;
  auVar202._4_4_ = auVar22._4_4_ * fVar100;
  auVar202._8_4_ = auVar22._8_4_ * fVar71;
  auVar202._12_4_ = auVar22._12_4_ * fVar101;
  auVar72 = vfmadd231ps_fma(auVar254,auVar269,auVar15);
  auVar107 = vfmadd231ps_fma(auVar221,auVar269,auVar19);
  auVar108 = vfmadd231ps_fma(auVar202,auVar174,auVar269);
  auVar269 = vshufps_avx(auVar243,auVar243,0xaa);
  fVar70 = auVar269._0_4_;
  auVar158._0_4_ = fVar70 * auVar18._0_4_;
  fVar100 = auVar269._4_4_;
  auVar158._4_4_ = fVar100 * auVar18._4_4_;
  fVar71 = auVar269._8_4_;
  auVar158._8_4_ = fVar71 * auVar18._8_4_;
  fVar101 = auVar269._12_4_;
  auVar158._12_4_ = fVar101 * auVar18._12_4_;
  auVar148._0_4_ = fVar70 * auVar21._0_4_;
  auVar148._4_4_ = fVar100 * auVar21._4_4_;
  auVar148._8_4_ = fVar71 * auVar21._8_4_;
  auVar148._12_4_ = fVar101 * auVar21._12_4_;
  auVar289._0_4_ = auVar22._0_4_ * fVar70;
  auVar289._4_4_ = auVar22._4_4_ * fVar100;
  auVar289._8_4_ = auVar22._8_4_ * fVar71;
  auVar289._12_4_ = auVar22._12_4_ * fVar101;
  auVar21 = vshufps_avx(auVar243,auVar243,0x55);
  auVar22 = vfmadd231ps_fma(auVar158,auVar21,auVar15);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar269 = vpmovsxwd_avx(auVar15);
  auVar134 = vfmadd231ps_fma(auVar148,auVar21,auVar19);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar23 = vpmovsxwd_avx(auVar18);
  auVar289 = vfmadd231ps_fma(auVar289,auVar21,auVar174);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar114 = vpmovsxwd_avx(auVar19);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar73 = vpmovsxwd_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar20);
  auVar19 = vcvtdq2ps_avx(auVar171);
  auVar106._4_4_ = auVar105._0_4_;
  auVar106._0_4_ = auVar105._0_4_;
  auVar106._8_4_ = auVar105._0_4_;
  auVar106._12_4_ = auVar105._0_4_;
  auVar21 = vfmadd231ps_fma(auVar72,auVar106,auVar15);
  auVar17 = vfmadd231ps_fma(auVar107,auVar106,auVar18);
  auVar171 = vfmadd231ps_fma(auVar108,auVar19,auVar106);
  auVar281._4_4_ = auVar243._0_4_;
  auVar281._0_4_ = auVar243._0_4_;
  auVar281._8_4_ = auVar243._0_4_;
  auVar281._12_4_ = auVar243._0_4_;
  auVar107 = vfmadd231ps_fma(auVar22,auVar281,auVar15);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar20 = vpmovsxwd_avx(auVar174);
  auVar108 = vfmadd231ps_fma(auVar134,auVar281,auVar18);
  local_4c0._8_4_ = 0x7fffffff;
  local_4c0._0_8_ = 0x7fffffff7fffffff;
  local_4c0._12_4_ = 0x7fffffff;
  auVar134 = vfmadd231ps_fma(auVar289,auVar281,auVar19);
  auVar15 = vandps_avx(auVar21,local_4c0);
  auVar301._8_4_ = 0x219392ef;
  auVar301._0_8_ = 0x219392ef219392ef;
  auVar301._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar301,1);
  auVar18 = vblendvps_avx(auVar21,auVar301,auVar15);
  auVar15 = vandps_avx(local_4c0,auVar17);
  auVar15 = vcmpps_avx(auVar15,auVar301,1);
  auVar19 = vblendvps_avx(auVar17,auVar301,auVar15);
  auVar15 = vandps_avx(local_4c0,auVar171);
  auVar15 = vcmpps_avx(auVar15,auVar301,1);
  auVar15 = vblendvps_avx(auVar171,auVar301,auVar15);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar60 * 0x16 + 6);
  auVar22 = vpmovsxwd_avx(auVar22);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar60 * 0x14 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar323._4_4_ = fVar103;
  auVar323._0_4_ = fVar103;
  auVar323._8_4_ = fVar103;
  auVar323._12_4_ = fVar103;
  auVar21 = vcvtdq2ps_avx(auVar269);
  auVar174 = vcvtdq2ps_avx(auVar23);
  auVar174 = vsubps_avx(auVar174,auVar21);
  auVar72 = vfmadd213ps_fma(auVar174,auVar323,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar114);
  auVar174 = vcvtdq2ps_avx(auVar73);
  auVar174 = vsubps_avx(auVar174,auVar21);
  auVar73 = vfmadd213ps_fma(auVar174,auVar323,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar20);
  auVar174 = vcvtdq2ps_avx(auVar22);
  auVar174 = vsubps_avx(auVar174,auVar21);
  auVar22 = vfmadd213ps_fma(auVar174,auVar323,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar17);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar174 = vpmovsxwd_avx(auVar20);
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar174 = vsubps_avx(auVar174,auVar21);
  auVar17 = vfmadd213ps_fma(auVar174,auVar323,auVar21);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar171);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar60 * 0x21 + 6);
  auVar174 = vpmovsxwd_avx(auVar269);
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar174 = vsubps_avx(auVar174,auVar21);
  auVar20 = vfmadd213ps_fma(auVar174,auVar323,auVar21);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar60 * 0x1f + 6);
  auVar21 = vpmovsxwd_avx(auVar23);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar174 = vpmovsxwd_avx(auVar114);
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar174 = vsubps_avx(auVar174,auVar21);
  auVar174 = vfmadd213ps_fma(auVar174,auVar323,auVar21);
  auVar21 = vrcpps_avx(auVar18);
  auVar302._8_4_ = 0x3f800000;
  auVar302._0_8_ = 0x3f8000003f800000;
  auVar302._12_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar18,auVar21,auVar302);
  auVar21 = vfmadd132ps_fma(auVar18,auVar21,auVar21);
  auVar18 = vrcpps_avx(auVar19);
  auVar19 = vfnmadd213ps_fma(auVar19,auVar18,auVar302);
  auVar19 = vfmadd132ps_fma(auVar19,auVar18,auVar18);
  auVar18 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar18,auVar302);
  auVar18 = vfmadd132ps_fma(auVar15,auVar18,auVar18);
  auVar15 = vsubps_avx(auVar72,auVar107);
  auVar72._0_4_ = auVar21._0_4_ * auVar15._0_4_;
  auVar72._4_4_ = auVar21._4_4_ * auVar15._4_4_;
  auVar72._8_4_ = auVar21._8_4_ * auVar15._8_4_;
  auVar72._12_4_ = auVar21._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar73,auVar107);
  auVar170._0_4_ = auVar21._0_4_ * auVar15._0_4_;
  auVar170._4_4_ = auVar21._4_4_ * auVar15._4_4_;
  auVar170._8_4_ = auVar21._8_4_ * auVar15._8_4_;
  auVar170._12_4_ = auVar21._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar22,auVar108);
  auVar186._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar186._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar186._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar186._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar108);
  auVar149._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar149._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar149._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar149._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar20,auVar134);
  auVar203._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar203._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar203._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar203._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar174,auVar134);
  auVar107._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar107._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar107._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar107._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar72,auVar170);
  auVar18 = vpminsd_avx(auVar186,auVar149);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vpminsd_avx(auVar203,auVar107);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar244._4_4_ = uVar69;
  auVar244._0_4_ = uVar69;
  auVar244._8_4_ = uVar69;
  auVar244._12_4_ = uVar69;
  auVar18 = vmaxps_avx(auVar18,auVar244);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  local_470._0_4_ = auVar15._0_4_ * 0.99999964;
  local_470._4_4_ = auVar15._4_4_ * 0.99999964;
  local_470._8_4_ = auVar15._8_4_ * 0.99999964;
  local_470._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar72,auVar170);
  auVar18 = vpmaxsd_avx(auVar186,auVar149);
  auVar15 = vminps_avx(auVar15,auVar18);
  auVar18 = vpmaxsd_avx(auVar203,auVar107);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar134._4_4_ = uVar69;
  auVar134._0_4_ = uVar69;
  auVar134._8_4_ = uVar69;
  auVar134._12_4_ = uVar69;
  auVar18 = vminps_avx(auVar18,auVar134);
  auVar15 = vminps_avx(auVar15,auVar18);
  auVar73._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar73._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar73._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar73._12_4_ = auVar15._12_4_ * 1.0000004;
  local_780._1_3_ = 0;
  auVar108[4] = local_780[0];
  auVar108._0_4_ = local_780._0_4_;
  auVar108._5_3_ = 0;
  auVar108[8] = local_780[0];
  auVar108._9_3_ = 0;
  auVar108[0xc] = local_780[0];
  auVar108._13_3_ = 0;
  auVar18 = vpcmpgtd_avx(auVar108,_DAT_01f4ad30);
  auVar15 = vcmpps_avx(local_470,auVar73,2);
  auVar15 = vandps_avx(auVar15,auVar18);
  uVar69 = vmovmskps_avx(auVar15);
  uVar60 = CONCAT44((int)((ulong)prim >> 0x20),uVar69);
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  iVar57 = 1 << ((uint)k & 0x1f);
  auVar96._4_4_ = iVar57;
  auVar96._0_4_ = iVar57;
  auVar96._8_4_ = iVar57;
  auVar96._12_4_ = iVar57;
  auVar96._16_4_ = iVar57;
  auVar96._20_4_ = iVar57;
  auVar96._24_4_ = iVar57;
  auVar96._28_4_ = iVar57;
  auVar25 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar95 = vpand_avx2(auVar96,auVar25);
  local_360 = vpcmpeqd_avx2(auVar95,auVar25);
LAB_0123e5de:
  if (uVar60 == 0) {
    return;
  }
  lVar65 = 0;
  for (uVar61 = uVar60; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar65 = lVar65 + 1;
  }
  uVar59 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar65 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar59].ptr;
  fVar70 = (pGVar8->time_range).lower;
  fVar100 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar70) / ((pGVar8->time_range).upper - fVar70));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar269 = vmaxss_avx(ZEXT816(0),auVar15);
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar68 = (long)(int)auVar269._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar68);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar68);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar61);
  lVar65 = uVar61 + 1;
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar65);
  lVar1 = uVar61 + 2;
  auVar19 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar61 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  auVar202 = *pauVar3;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar68);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar68);
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar61);
  auVar174 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar65);
  auVar22 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar70 = *pfVar4;
  fVar103 = pfVar4[1];
  fVar71 = pfVar4[2];
  fVar101 = pfVar4[3];
  auVar106 = ZEXT816(0) << 0x40;
  auVar267._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar267._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar267._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar267._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar150._8_4_ = 0x3e2aaaab;
  auVar150._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar150._12_4_ = 0x3e2aaaab;
  auVar73 = vfmadd213ps_fma(auVar150,auVar19,auVar267);
  auVar303._8_4_ = 0x3f000000;
  auVar303._0_8_ = 0x3f0000003f000000;
  auVar303._12_4_ = 0x3f000000;
  auVar17 = vfmadd231ps_fma(auVar267,auVar19,auVar303);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar18,auVar106);
  auVar149 = vfnmadd231ps_fma(auVar17,auVar15,auVar303);
  auVar187._0_4_ = fVar70 * 0.0;
  auVar187._4_4_ = fVar103 * 0.0;
  auVar187._8_4_ = fVar71 * 0.0;
  auVar187._12_4_ = fVar101 * 0.0;
  auVar17 = vfmadd213ps_fma(auVar150,auVar22,auVar187);
  auVar151._8_4_ = 0x3f2aaaab;
  auVar151._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar151._12_4_ = 0x3f2aaaab;
  auVar17 = vfmadd231ps_fma(auVar17,auVar174,auVar151);
  auVar17 = vfmadd231ps_fma(auVar17,auVar21,auVar150);
  auVar20 = vfmadd231ps_fma(auVar187,auVar22,auVar303);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar174,auVar106);
  auVar171 = vfnmadd231ps_fma(auVar20,auVar21,auVar303);
  auVar286._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar286._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar286._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar286._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar20 = vfmadd231ps_fma(auVar286,auVar106,auVar19);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar303,auVar18);
  auVar158 = vfnmadd231ps_fma(auVar20,auVar106,auVar15);
  auVar255._0_4_ = fVar70 * 0.16666667;
  auVar255._4_4_ = fVar103 * 0.16666667;
  auVar255._8_4_ = fVar71 * 0.16666667;
  auVar255._12_4_ = fVar101 * 0.16666667;
  auVar20 = vfmadd231ps_fma(auVar255,auVar22,auVar151);
  auVar20 = vfmadd231ps_fma(auVar20,auVar174,auVar150);
  auVar20 = vfmadd231ps_fma(auVar20,auVar21,auVar106);
  auVar204._0_4_ = fVar70 * 0.5;
  auVar204._4_4_ = fVar103 * 0.5;
  auVar204._8_4_ = fVar71 * 0.5;
  auVar204._12_4_ = fVar101 * 0.5;
  auVar22 = vfmadd231ps_fma(auVar204,auVar106,auVar22);
  auVar174 = vfnmadd231ps_fma(auVar22,auVar303,auVar174);
  auVar22 = vfnmadd231ps_fma(auVar174,auVar106,auVar21);
  auVar21 = vshufps_avx(auVar149,auVar149,0xc9);
  auVar174 = vshufps_avx(auVar17,auVar17,0xc9);
  fVar241 = auVar149._0_4_;
  auVar109._0_4_ = fVar241 * auVar174._0_4_;
  fVar242 = auVar149._4_4_;
  auVar109._4_4_ = fVar242 * auVar174._4_4_;
  fVar102 = auVar149._8_4_;
  auVar109._8_4_ = fVar102 * auVar174._8_4_;
  fVar279 = auVar149._12_4_;
  auVar109._12_4_ = fVar279 * auVar174._12_4_;
  auVar107 = vfmsub231ps_fma(auVar109,auVar21,auVar17);
  auVar174 = vshufps_avx(auVar171,auVar171,0xc9);
  auVar110._0_4_ = fVar241 * auVar174._0_4_;
  auVar110._4_4_ = fVar242 * auVar174._4_4_;
  auVar110._8_4_ = fVar102 * auVar174._8_4_;
  auVar110._12_4_ = fVar279 * auVar174._12_4_;
  auVar108 = vfmsub231ps_fma(auVar110,auVar21,auVar171);
  auVar21 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar174 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar285 = auVar158._0_4_;
  auVar111._0_4_ = fVar285 * auVar174._0_4_;
  fVar298 = auVar158._4_4_;
  auVar111._4_4_ = fVar298 * auVar174._4_4_;
  fVar299 = auVar158._8_4_;
  auVar111._8_4_ = fVar299 * auVar174._8_4_;
  fVar300 = auVar158._12_4_;
  auVar111._12_4_ = fVar300 * auVar174._12_4_;
  auVar134 = vfmsub231ps_fma(auVar111,auVar21,auVar20);
  auVar174 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar112._0_4_ = fVar285 * auVar174._0_4_;
  auVar112._4_4_ = fVar298 * auVar174._4_4_;
  auVar112._8_4_ = fVar299 * auVar174._8_4_;
  auVar112._12_4_ = fVar300 * auVar174._12_4_;
  auVar289 = vfmsub231ps_fma(auVar112,auVar21,auVar22);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar68);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar68);
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar5 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar56 = *pauVar5;
  fVar147 = *(float *)pauVar5[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar68);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar68);
  auVar256._0_4_ = *(float *)*pauVar5 * 0.0;
  auVar256._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
  auVar256._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
  auVar256._12_4_ = fVar147 * 0.0;
  auVar72 = vfmadd213ps_fma(auVar150,auVar21,auVar256);
  auVar22 = vfmadd231ps_fma(auVar256,auVar21,auVar303);
  auVar174 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar65);
  auVar17 = vfnmadd231ps_fma(auVar22,auVar174,auVar106);
  auVar22 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar61);
  auVar170 = vfnmadd231ps_fma(auVar17,auVar22,auVar303);
  auVar17 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar70 = *pfVar4;
  fVar103 = pfVar4[1];
  fVar71 = pfVar4[2];
  fVar101 = pfVar4[3];
  auVar74._0_4_ = fVar70 * 0.0;
  auVar74._4_4_ = fVar103 * 0.0;
  auVar74._8_4_ = fVar71 * 0.0;
  auVar74._12_4_ = fVar101 * 0.0;
  auVar171 = vfmadd213ps_fma(auVar150,auVar17,auVar74);
  auVar20 = *(undefined1 (*) [16])(lVar13 + lVar65 * lVar10);
  auVar113._8_4_ = 0x3f2aaaab;
  auVar113._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar113._12_4_ = 0x3f2aaaab;
  auVar23 = vfmadd231ps_fma(auVar171,auVar20,auVar113);
  auVar171 = *(undefined1 (*) [16])(lVar13 + uVar61 * lVar10);
  auVar114 = vfmadd231ps_fma(auVar23,auVar171,auVar150);
  auVar23 = vshufps_avx(auVar114,auVar114,0xc9);
  fVar235 = auVar170._0_4_;
  auVar222._0_4_ = fVar235 * auVar23._0_4_;
  fVar237 = auVar170._4_4_;
  auVar222._4_4_ = fVar237 * auVar23._4_4_;
  fVar239 = auVar170._8_4_;
  auVar222._8_4_ = fVar239 * auVar23._8_4_;
  fVar240 = auVar170._12_4_;
  auVar222._12_4_ = fVar240 * auVar23._12_4_;
  auVar23 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar105 = vfmsub231ps_fma(auVar222,auVar23,auVar114);
  auVar114 = vfmadd231ps_fma(auVar74,auVar17,auVar303);
  auVar114 = vfnmadd231ps_fma(auVar114,auVar20,auVar106);
  auVar106 = vfnmadd231ps_fma(auVar114,auVar171,auVar303);
  auVar114 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar223._0_4_ = fVar235 * auVar114._0_4_;
  auVar223._4_4_ = fVar237 * auVar114._4_4_;
  auVar223._8_4_ = fVar239 * auVar114._8_4_;
  auVar223._12_4_ = fVar240 * auVar114._12_4_;
  auVar106 = vfmsub231ps_fma(auVar223,auVar23,auVar106);
  auVar75._0_4_ = fVar70 * 0.16666667;
  auVar75._4_4_ = fVar103 * 0.16666667;
  auVar75._8_4_ = fVar71 * 0.16666667;
  auVar75._12_4_ = fVar101 * 0.16666667;
  auVar324._8_4_ = 0x3f2aaaab;
  auVar324._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar324._12_4_ = 0x3f2aaaab;
  auVar23 = vfmadd231ps_fma(auVar75,auVar17,auVar324);
  auVar152._0_4_ = fVar70 * 0.5;
  auVar152._4_4_ = fVar103 * 0.5;
  auVar152._8_4_ = fVar71 * 0.5;
  auVar152._12_4_ = fVar101 * 0.5;
  auVar114 = ZEXT816(0) << 0x20;
  auVar17 = vfmadd231ps_fma(auVar152,auVar114,auVar17);
  auVar23 = vfmadd231ps_fma(auVar23,auVar20,auVar150);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar303,auVar20);
  auVar20 = vfmadd231ps_fma(auVar23,auVar171,auVar114);
  auVar171 = vfnmadd231ps_fma(auVar17,auVar114,auVar171);
  local_7a0 = auVar56._0_4_;
  fStack_79c = auVar56._4_4_;
  fStack_798 = auVar56._8_4_;
  auVar188._0_4_ = local_7a0 * 0.5;
  auVar188._4_4_ = fStack_79c * 0.5;
  auVar188._8_4_ = fStack_798 * 0.5;
  auVar188._12_4_ = fVar147 * 0.5;
  auVar17 = vfmadd231ps_fma(auVar188,auVar114,auVar21);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar303,auVar174);
  auVar186 = vfnmadd231ps_fma(auVar17,auVar114,auVar22);
  auVar17 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar184 = auVar186._0_4_;
  auVar115._0_4_ = fVar184 * auVar17._0_4_;
  fVar185 = auVar186._4_4_;
  auVar115._4_4_ = fVar185 * auVar17._4_4_;
  fVar200 = auVar186._8_4_;
  auVar115._8_4_ = fVar200 * auVar17._8_4_;
  fVar201 = auVar186._12_4_;
  auVar115._12_4_ = fVar201 * auVar17._12_4_;
  auVar17 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar281 = vfmsub231ps_fma(auVar115,auVar17,auVar20);
  auVar20 = vshufps_avx(auVar171,auVar171,0xc9);
  auVar76._0_4_ = fVar184 * auVar20._0_4_;
  auVar76._4_4_ = fVar185 * auVar20._4_4_;
  auVar76._8_4_ = fVar200 * auVar20._8_4_;
  auVar76._12_4_ = fVar201 * auVar20._12_4_;
  auVar148 = vfmsub231ps_fma(auVar76,auVar17,auVar171);
  fVar100 = fVar100 - auVar269._0_4_;
  local_700._0_4_ = auVar202._0_4_;
  local_700._4_4_ = auVar202._4_4_;
  uStack_6f8._0_4_ = auVar202._8_4_;
  uStack_6f8._4_4_ = auVar202._12_4_;
  auVar116._0_4_ = (float)local_700._0_4_ * 0.16666667;
  auVar116._4_4_ = (float)local_700._4_4_ * 0.16666667;
  auVar116._8_4_ = (float)uStack_6f8 * 0.16666667;
  auVar116._12_4_ = uStack_6f8._4_4_ * 0.16666667;
  auVar17 = vfmadd231ps_fma(auVar116,auVar324,auVar19);
  auVar171 = vfmadd231ps_fma(auVar73,auVar18,auVar324);
  auVar20 = vpermilps_avx(auVar107,0xc9);
  auVar19 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar18 = vfmadd231ps_fma(auVar17,auVar18,auVar150);
  auVar269 = vfmadd231ps_fma(auVar171,auVar15,auVar150);
  auVar52._12_4_ = 0;
  auVar52._0_12_ = ZEXT812(0);
  auVar23 = vfmadd231ps_fma(auVar18,auVar15,auVar52 << 0x20);
  fVar103 = auVar19._0_4_;
  auVar171 = ZEXT416((uint)fVar103);
  auVar15 = vrsqrtss_avx(auVar171,auVar171);
  fVar70 = auVar15._0_4_;
  fVar70 = fVar103 * -0.5 * fVar70 * fVar70 * fVar70 + fVar70 * 1.5;
  auVar18 = vpermilps_avx(auVar108,0xc9);
  auVar15 = vdpps_avx(auVar20,auVar18,0x7f);
  auVar304._0_4_ = fVar103 * auVar18._0_4_;
  auVar304._4_4_ = fVar103 * auVar18._4_4_;
  auVar304._8_4_ = fVar103 * auVar18._8_4_;
  auVar304._12_4_ = fVar103 * auVar18._12_4_;
  fVar103 = auVar15._0_4_;
  auVar315._0_4_ = fVar103 * auVar20._0_4_;
  auVar315._4_4_ = fVar103 * auVar20._4_4_;
  auVar315._8_4_ = fVar103 * auVar20._8_4_;
  auVar315._12_4_ = fVar103 * auVar20._12_4_;
  auVar17 = vsubps_avx(auVar304,auVar315);
  auVar15 = vrcpss_avx(auVar171,auVar171);
  auVar18 = vfnmadd213ss_fma(auVar19,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar71 = auVar15._0_4_ * auVar18._0_4_;
  auVar171 = vpermilps_avx(auVar134,0xc9);
  auVar18 = vdpps_avx(auVar171,auVar171,0x7f);
  fVar220 = auVar20._0_4_ * fVar70;
  fVar234 = auVar20._4_4_ * fVar70;
  fVar236 = auVar20._8_4_ * fVar70;
  fVar238 = auVar20._12_4_ * fVar70;
  auVar20 = vpermilps_avx(auVar289,0xc9);
  auVar15 = vblendps_avx(auVar18,_DAT_01f45a50,0xe);
  auVar19 = vrsqrtss_avx(auVar15,auVar15);
  fVar101 = auVar18._0_4_;
  fVar103 = auVar19._0_4_;
  auVar19 = vdpps_avx(auVar171,auVar20,0x7f);
  fVar103 = fVar103 * 1.5 + fVar103 * fVar101 * -0.5 * fVar103 * fVar103;
  auVar153._0_4_ = fVar101 * auVar20._0_4_;
  auVar153._4_4_ = fVar101 * auVar20._4_4_;
  auVar153._8_4_ = fVar101 * auVar20._8_4_;
  auVar153._12_4_ = fVar101 * auVar20._12_4_;
  fVar101 = auVar19._0_4_;
  auVar135._0_4_ = fVar101 * auVar171._0_4_;
  auVar135._4_4_ = fVar101 * auVar171._4_4_;
  auVar135._8_4_ = fVar101 * auVar171._8_4_;
  auVar135._12_4_ = fVar101 * auVar171._12_4_;
  auVar19 = vsubps_avx(auVar153,auVar135);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar18 = vfnmadd213ss_fma(auVar18,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar101 = auVar18._0_4_ * auVar15._0_4_;
  fVar146 = auVar171._0_4_ * fVar103;
  fVar167 = auVar171._4_4_ * fVar103;
  fVar168 = auVar171._8_4_ * fVar103;
  fVar169 = auVar171._12_4_ * fVar103;
  auVar15 = vshufps_avx(auVar149,auVar149,0xff);
  auVar18 = vshufps_avx(auVar269,auVar269,0xff);
  auVar205._0_4_ = auVar18._0_4_ * fVar220;
  auVar205._4_4_ = auVar18._4_4_ * fVar234;
  auVar205._8_4_ = auVar18._8_4_ * fVar236;
  auVar205._12_4_ = auVar18._12_4_ * fVar238;
  auVar172._0_4_ = auVar15._0_4_ * fVar220 + fVar70 * auVar17._0_4_ * fVar71 * auVar18._0_4_;
  auVar172._4_4_ = auVar15._4_4_ * fVar234 + fVar70 * auVar17._4_4_ * fVar71 * auVar18._4_4_;
  auVar172._8_4_ = auVar15._8_4_ * fVar236 + fVar70 * auVar17._8_4_ * fVar71 * auVar18._8_4_;
  auVar172._12_4_ = auVar15._12_4_ * fVar238 + fVar70 * auVar17._12_4_ * fVar71 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar269,auVar205);
  local_780._0_4_ = auVar269._0_4_ + auVar205._0_4_;
  local_780._4_4_ = auVar269._4_4_ + auVar205._4_4_;
  uStack_778._0_4_ = auVar269._8_4_ + auVar205._8_4_;
  uStack_778._4_4_ = auVar269._12_4_ + auVar205._12_4_;
  auVar20 = vsubps_avx(auVar149,auVar172);
  auVar15 = vshufps_avx(auVar158,auVar158,0xff);
  auVar18 = vshufps_avx(auVar23,auVar23,0xff);
  auVar154._0_4_ = auVar18._0_4_ * fVar146;
  auVar154._4_4_ = auVar18._4_4_ * fVar167;
  auVar154._8_4_ = auVar18._8_4_ * fVar168;
  auVar154._12_4_ = auVar18._12_4_ * fVar169;
  auVar173._0_4_ = auVar15._0_4_ * fVar146 + auVar18._0_4_ * fVar103 * auVar19._0_4_ * fVar101;
  auVar173._4_4_ = auVar15._4_4_ * fVar167 + auVar18._4_4_ * fVar103 * auVar19._4_4_ * fVar101;
  auVar173._8_4_ = auVar15._8_4_ * fVar168 + auVar18._8_4_ * fVar103 * auVar19._8_4_ * fVar101;
  auVar173._12_4_ = auVar15._12_4_ * fVar169 + auVar18._12_4_ * fVar103 * auVar19._12_4_ * fVar101;
  auVar19 = vsubps_avx(auVar23,auVar154);
  local_700._4_4_ = auVar23._4_4_ + auVar154._4_4_;
  local_700._0_4_ = auVar23._0_4_ + auVar154._0_4_;
  uStack_6f8._0_4_ = auVar23._8_4_ + auVar154._8_4_;
  uStack_6f8._4_4_ = auVar23._12_4_ + auVar154._12_4_;
  auVar171 = vsubps_avx(auVar158,auVar173);
  auVar136._8_4_ = 0x3e2aaaab;
  auVar136._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar136._12_4_ = 0x3e2aaaab;
  auVar305._0_4_ = local_7a0 * 0.16666667;
  auVar305._4_4_ = fStack_79c * 0.16666667;
  auVar305._8_4_ = fStack_798 * 0.16666667;
  auVar305._12_4_ = fVar147 * 0.16666667;
  auVar117._8_4_ = 0x3f2aaaab;
  auVar117._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar117._12_4_ = 0x3f2aaaab;
  auVar18 = vfmadd231ps_fma(auVar305,auVar117,auVar21);
  auVar21 = vfmadd231ps_fma(auVar72,auVar174,auVar117);
  auVar269 = vpermilps_avx(auVar105,0xc9);
  auVar15 = vdpps_avx(auVar269,auVar269,0x7f);
  auVar18 = vfmadd231ps_fma(auVar18,auVar174,auVar136);
  auVar23 = vfmadd231ps_fma(auVar21,auVar22,auVar136);
  auVar53._12_4_ = 0;
  auVar53._0_12_ = ZEXT812(0);
  auVar114 = vfmadd231ps_fma(auVar18,auVar22,auVar53 << 0x20);
  fVar103 = auVar15._0_4_;
  auVar174 = ZEXT416((uint)fVar103);
  auVar18 = vrsqrtss_avx(auVar174,auVar174);
  fVar70 = auVar18._0_4_;
  fVar70 = fVar70 * 1.5 + fVar70 * fVar70 * fVar103 * -0.5 * fVar70;
  auVar21 = vpermilps_avx(auVar106,0xc9);
  auVar18 = vdpps_avx(auVar269,auVar21,0x7f);
  auVar224._0_4_ = fVar103 * auVar21._0_4_;
  auVar224._4_4_ = fVar103 * auVar21._4_4_;
  auVar224._8_4_ = fVar103 * auVar21._8_4_;
  auVar224._12_4_ = fVar103 * auVar21._12_4_;
  fVar103 = auVar18._0_4_;
  auVar268._0_4_ = fVar103 * auVar269._0_4_;
  auVar268._4_4_ = fVar103 * auVar269._4_4_;
  auVar268._8_4_ = fVar103 * auVar269._8_4_;
  auVar268._12_4_ = fVar103 * auVar269._12_4_;
  auVar21 = vsubps_avx(auVar224,auVar268);
  auVar18 = vrcpss_avx(auVar174,auVar174);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar71 = auVar18._0_4_ * auVar15._0_4_;
  auVar22 = vpermilps_avx(auVar281,0xc9);
  auVar15 = vdpps_avx(auVar22,auVar22,0x7f);
  fVar147 = auVar269._0_4_ * fVar70;
  fVar146 = auVar269._4_4_ * fVar70;
  fVar167 = auVar269._8_4_ * fVar70;
  fVar168 = auVar269._12_4_ * fVar70;
  auVar174 = vpermilps_avx(auVar148,0xc9);
  fVar101 = auVar15._0_4_;
  auVar269 = ZEXT416((uint)fVar101);
  auVar18 = vrsqrtss_avx(auVar269,auVar269);
  fVar103 = auVar18._0_4_;
  auVar18 = vdpps_avx(auVar22,auVar174,0x7f);
  fVar103 = fVar103 * 1.5 + fVar101 * -0.5 * fVar103 * fVar103 * fVar103;
  auVar175._0_4_ = fVar101 * auVar174._0_4_;
  auVar175._4_4_ = fVar101 * auVar174._4_4_;
  auVar175._8_4_ = fVar101 * auVar174._8_4_;
  auVar175._12_4_ = fVar101 * auVar174._12_4_;
  fVar101 = auVar18._0_4_;
  auVar287._0_4_ = fVar101 * auVar22._0_4_;
  auVar287._4_4_ = fVar101 * auVar22._4_4_;
  auVar287._8_4_ = fVar101 * auVar22._8_4_;
  auVar287._12_4_ = fVar101 * auVar22._12_4_;
  auVar174 = vsubps_avx(auVar175,auVar287);
  auVar18 = vrcpss_avx(auVar269,auVar269);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar18,ZEXT416(0x40000000));
  fVar101 = auVar18._0_4_ * auVar15._0_4_;
  fVar169 = auVar22._0_4_ * fVar103;
  fVar220 = auVar22._4_4_ * fVar103;
  fVar234 = auVar22._8_4_ * fVar103;
  fVar236 = auVar22._12_4_ * fVar103;
  auVar15 = vshufps_avx(auVar170,auVar170,0xff);
  auVar18 = vshufps_avx(auVar23,auVar23,0xff);
  auVar155._0_4_ = auVar18._0_4_ * fVar147;
  auVar155._4_4_ = auVar18._4_4_ * fVar146;
  auVar155._8_4_ = auVar18._8_4_ * fVar167;
  auVar155._12_4_ = auVar18._12_4_ * fVar168;
  auVar118._0_4_ = auVar15._0_4_ * fVar147 + auVar18._0_4_ * fVar70 * fVar71 * auVar21._0_4_;
  auVar118._4_4_ = auVar15._4_4_ * fVar146 + auVar18._4_4_ * fVar70 * fVar71 * auVar21._4_4_;
  auVar118._8_4_ = auVar15._8_4_ * fVar167 + auVar18._8_4_ * fVar70 * fVar71 * auVar21._8_4_;
  auVar118._12_4_ = auVar15._12_4_ * fVar168 + auVar18._12_4_ * fVar70 * fVar71 * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar23,auVar155);
  fVar71 = auVar23._0_4_ + auVar155._0_4_;
  fVar147 = auVar23._4_4_ + auVar155._4_4_;
  fVar146 = auVar23._8_4_ + auVar155._8_4_;
  fVar167 = auVar23._12_4_ + auVar155._12_4_;
  auVar22 = vsubps_avx(auVar170,auVar118);
  auVar15 = vshufps_avx(auVar186,auVar186,0xff);
  auVar18 = vshufps_avx(auVar114,auVar114,0xff);
  auVar288._0_4_ = auVar18._0_4_ * fVar169;
  auVar288._4_4_ = auVar18._4_4_ * fVar220;
  auVar288._8_4_ = auVar18._8_4_ * fVar234;
  auVar288._12_4_ = auVar18._12_4_ * fVar236;
  auVar119._0_4_ = auVar15._0_4_ * fVar169 + auVar18._0_4_ * fVar103 * auVar174._0_4_ * fVar101;
  auVar119._4_4_ = auVar15._4_4_ * fVar220 + auVar18._4_4_ * fVar103 * auVar174._4_4_ * fVar101;
  auVar119._8_4_ = auVar15._8_4_ * fVar234 + auVar18._8_4_ * fVar103 * auVar174._8_4_ * fVar101;
  auVar119._12_4_ = auVar15._12_4_ * fVar236 + auVar18._12_4_ * fVar103 * auVar174._12_4_ * fVar101;
  auVar15 = vsubps_avx(auVar114,auVar288);
  local_740._0_4_ = auVar114._0_4_ + auVar288._0_4_;
  local_740._4_4_ = auVar114._4_4_ + auVar288._4_4_;
  fStack_738 = auVar114._8_4_ + auVar288._8_4_;
  fStack_734 = auVar114._12_4_ + auVar288._12_4_;
  auVar18 = vsubps_avx(auVar186,auVar119);
  local_620._0_4_ = auVar20._0_4_;
  local_620._4_4_ = auVar20._4_4_;
  fStack_618 = auVar20._8_4_;
  fStack_614 = auVar20._12_4_;
  auVar189._0_4_ = auVar17._0_4_ + (float)local_620._0_4_ * 0.33333334;
  auVar189._4_4_ = auVar17._4_4_ + (float)local_620._4_4_ * 0.33333334;
  auVar189._8_4_ = auVar17._8_4_ + fStack_618 * 0.33333334;
  auVar189._12_4_ = auVar17._12_4_ + fStack_614 * 0.33333334;
  fVar70 = 1.0 - fVar100;
  auVar120._4_4_ = fVar70;
  auVar120._0_4_ = fVar70;
  auVar120._8_4_ = fVar70;
  auVar120._12_4_ = fVar70;
  auVar77._0_4_ = fVar100 * auVar21._0_4_;
  auVar77._4_4_ = fVar100 * auVar21._4_4_;
  auVar77._8_4_ = fVar100 * auVar21._8_4_;
  auVar77._12_4_ = fVar100 * auVar21._12_4_;
  local_500 = vfmadd231ps_fma(auVar77,auVar120,auVar17);
  auVar78._0_4_ = fVar100 * (auVar21._0_4_ + auVar22._0_4_ * 0.33333334);
  auVar78._4_4_ = fVar100 * (auVar21._4_4_ + auVar22._4_4_ * 0.33333334);
  auVar78._8_4_ = fVar100 * (auVar21._8_4_ + auVar22._8_4_ * 0.33333334);
  auVar78._12_4_ = fVar100 * (auVar21._12_4_ + auVar22._12_4_ * 0.33333334);
  auVar17 = vfmadd231ps_fma(auVar78,auVar120,auVar189);
  local_660 = auVar171._0_4_;
  fStack_65c = auVar171._4_4_;
  fStack_658 = auVar171._8_4_;
  fStack_654 = auVar171._12_4_;
  auVar137._0_4_ = local_660 * 0.33333334;
  auVar137._4_4_ = fStack_65c * 0.33333334;
  auVar137._8_4_ = fStack_658 * 0.33333334;
  auVar137._12_4_ = fStack_654 * 0.33333334;
  auVar21 = vsubps_avx(auVar19,auVar137);
  auVar306._0_4_ = (float)local_780._0_4_ + (fVar241 + auVar172._0_4_) * 0.33333334;
  auVar306._4_4_ = (float)local_780._4_4_ + (fVar242 + auVar172._4_4_) * 0.33333334;
  auVar306._8_4_ = (float)uStack_778 + (fVar102 + auVar172._8_4_) * 0.33333334;
  auVar306._12_4_ = uStack_778._4_4_ + (fVar279 + auVar172._12_4_) * 0.33333334;
  auVar245._0_4_ = (fVar285 + auVar173._0_4_) * 0.33333334;
  auVar245._4_4_ = (fVar298 + auVar173._4_4_) * 0.33333334;
  auVar245._8_4_ = (fVar299 + auVar173._8_4_) * 0.33333334;
  auVar245._12_4_ = (fVar300 + auVar173._12_4_) * 0.33333334;
  auVar174 = vsubps_avx(_local_700,auVar245);
  auVar280._0_4_ = auVar18._0_4_ * 0.33333334;
  auVar280._4_4_ = auVar18._4_4_ * 0.33333334;
  auVar280._8_4_ = auVar18._8_4_ * 0.33333334;
  auVar280._12_4_ = auVar18._12_4_ * 0.33333334;
  auVar18 = vsubps_avx(auVar15,auVar280);
  auVar257._0_4_ = (fVar184 + auVar119._0_4_) * 0.33333334;
  auVar257._4_4_ = (fVar185 + auVar119._4_4_) * 0.33333334;
  auVar257._8_4_ = (fVar200 + auVar119._8_4_) * 0.33333334;
  auVar257._12_4_ = (fVar201 + auVar119._12_4_) * 0.33333334;
  auVar22 = vsubps_avx(_local_740,auVar257);
  auVar79._0_4_ = fVar100 * auVar18._0_4_;
  auVar79._4_4_ = fVar100 * auVar18._4_4_;
  auVar79._8_4_ = fVar100 * auVar18._8_4_;
  auVar79._12_4_ = fVar100 * auVar18._12_4_;
  auVar225._0_4_ = fVar100 * auVar15._0_4_;
  auVar225._4_4_ = fVar100 * auVar15._4_4_;
  auVar225._8_4_ = fVar100 * auVar15._8_4_;
  auVar225._12_4_ = fVar100 * auVar15._12_4_;
  local_510 = vfmadd231ps_fma(auVar79,auVar120,auVar21);
  local_520 = vfmadd231ps_fma(auVar225,auVar120,auVar19);
  auVar80._0_4_ = fVar100 * fVar71;
  auVar80._4_4_ = fVar100 * fVar147;
  auVar80._8_4_ = fVar100 * fVar146;
  auVar80._12_4_ = fVar100 * fVar167;
  auVar138._0_4_ = fVar100 * (fVar71 + (fVar235 + auVar118._0_4_) * 0.33333334);
  auVar138._4_4_ = fVar100 * (fVar147 + (fVar237 + auVar118._4_4_) * 0.33333334);
  auVar138._8_4_ = fVar100 * (fVar146 + (fVar239 + auVar118._8_4_) * 0.33333334);
  auVar138._12_4_ = fVar100 * (fVar167 + (fVar240 + auVar118._12_4_) * 0.33333334);
  auVar156._0_4_ = fVar100 * auVar22._0_4_;
  auVar156._4_4_ = fVar100 * auVar22._4_4_;
  auVar156._8_4_ = fVar100 * auVar22._8_4_;
  auVar156._12_4_ = fVar100 * auVar22._12_4_;
  auVar176._0_4_ = fVar100 * (float)local_740._0_4_;
  auVar176._4_4_ = fVar100 * (float)local_740._4_4_;
  auVar176._8_4_ = fVar100 * fStack_738;
  auVar176._12_4_ = fVar100 * fStack_734;
  _local_530 = vfmadd231ps_fma(auVar80,auVar120,_local_780);
  _local_540 = vfmadd231ps_fma(auVar138,auVar120,auVar306);
  auVar20 = vfmadd231ps_fma(auVar156,auVar120,auVar174);
  auVar171 = vfmadd231ps_fma(auVar176,auVar120,_local_700);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_4e0 = vsubps_avx(local_500,auVar15);
  auVar18 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar19 = vshufps_avx(local_4e0,local_4e0,0xaa);
  aVar6 = pre->ray_space[k].vy.field_0;
  fVar70 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar100 = pre->ray_space[k].vz.field_0.m128[2];
  fVar71 = pre->ray_space[k].vz.field_0.m128[3];
  auVar81._0_4_ = fVar70 * auVar19._0_4_;
  auVar81._4_4_ = fVar103 * auVar19._4_4_;
  auVar81._8_4_ = fVar100 * auVar19._8_4_;
  auVar81._12_4_ = fVar71 * auVar19._12_4_;
  auVar21 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar6,auVar18);
  local_4f0 = vsubps_avx(auVar17,auVar15);
  auVar18 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar19 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar325._0_4_ = fVar70 * auVar19._0_4_;
  auVar325._4_4_ = fVar103 * auVar19._4_4_;
  auVar325._8_4_ = fVar100 * auVar19._8_4_;
  auVar325._12_4_ = fVar71 * auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar325,(undefined1  [16])aVar6,auVar18);
  local_3c0 = vsubps_avx(local_510,auVar15);
  auVar18 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar307._0_4_ = fVar70 * auVar18._0_4_;
  auVar307._4_4_ = fVar103 * auVar18._4_4_;
  auVar307._8_4_ = fVar100 * auVar18._8_4_;
  auVar307._12_4_ = fVar71 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar174 = vfmadd231ps_fma(auVar307,(undefined1  [16])aVar6,auVar18);
  local_3d0 = vsubps_avx(local_520,auVar15);
  auVar18 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar316._0_4_ = fVar70 * auVar18._0_4_;
  auVar316._4_4_ = fVar103 * auVar18._4_4_;
  auVar316._8_4_ = fVar100 * auVar18._8_4_;
  auVar316._12_4_ = fVar71 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar22 = vfmadd231ps_fma(auVar316,(undefined1  [16])aVar6,auVar18);
  local_3e0 = vsubps_avx(_local_530,auVar15);
  auVar18 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar177._0_4_ = fVar70 * auVar18._0_4_;
  auVar177._4_4_ = fVar103 * auVar18._4_4_;
  auVar177._8_4_ = fVar100 * auVar18._8_4_;
  auVar177._12_4_ = fVar71 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar269 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar6,auVar18);
  local_3f0 = vsubps_avx(_local_540,auVar15);
  auVar18 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar226._0_4_ = fVar70 * auVar18._0_4_;
  auVar226._4_4_ = fVar103 * auVar18._4_4_;
  auVar226._8_4_ = fVar100 * auVar18._8_4_;
  auVar226._12_4_ = fVar71 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar23 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar6,auVar18);
  local_400 = vsubps_avx(auVar20,auVar15);
  auVar18 = vshufps_avx(local_400,local_400,0xaa);
  auVar258._0_4_ = fVar70 * auVar18._0_4_;
  auVar258._4_4_ = fVar103 * auVar18._4_4_;
  auVar258._8_4_ = fVar100 * auVar18._8_4_;
  auVar258._12_4_ = fVar71 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_400,local_400,0x55);
  auVar18 = vfmadd231ps_fma(auVar258,(undefined1  [16])aVar6,auVar18);
  local_410 = vsubps_avx(auVar171,auVar15);
  auVar15 = vshufps_avx(local_410,local_410,0xaa);
  auVar190._0_4_ = fVar70 * auVar15._0_4_;
  auVar190._4_4_ = fVar103 * auVar15._4_4_;
  auVar190._8_4_ = fVar100 * auVar15._8_4_;
  auVar190._12_4_ = fVar71 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_410,local_410,0x55);
  auVar15 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar6,auVar15);
  auVar206._4_4_ = local_4e0._0_4_;
  auVar206._0_4_ = local_4e0._0_4_;
  auVar206._8_4_ = local_4e0._0_4_;
  auVar206._12_4_ = local_4e0._0_4_;
  aVar6 = pre->ray_space[k].vx.field_0;
  auVar114 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar206);
  auVar207._4_4_ = local_4f0._0_4_;
  auVar207._0_4_ = local_4f0._0_4_;
  auVar207._8_4_ = local_4f0._0_4_;
  auVar207._12_4_ = local_4f0._0_4_;
  auVar73 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar207);
  uVar69 = local_3c0._0_4_;
  auVar208._4_4_ = uVar69;
  auVar208._0_4_ = uVar69;
  auVar208._8_4_ = uVar69;
  auVar208._12_4_ = uVar69;
  auVar72 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar6,auVar208);
  uVar69 = local_3d0._0_4_;
  auVar209._4_4_ = uVar69;
  auVar209._0_4_ = uVar69;
  auVar209._8_4_ = uVar69;
  auVar209._12_4_ = uVar69;
  auVar107 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar6,auVar209);
  uVar69 = local_3e0._0_4_;
  auVar210._4_4_ = uVar69;
  auVar210._0_4_ = uVar69;
  auVar210._8_4_ = uVar69;
  auVar210._12_4_ = uVar69;
  auVar269 = vfmadd231ps_fma(auVar269,(undefined1  [16])aVar6,auVar210);
  uVar69 = local_3f0._0_4_;
  auVar211._4_4_ = uVar69;
  auVar211._0_4_ = uVar69;
  auVar211._8_4_ = uVar69;
  auVar211._12_4_ = uVar69;
  auVar23 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar6,auVar211);
  uVar69 = local_400._0_4_;
  auVar212._4_4_ = uVar69;
  auVar212._0_4_ = uVar69;
  auVar212._8_4_ = uVar69;
  auVar212._12_4_ = uVar69;
  auVar108 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar6,auVar212);
  uVar69 = local_410._0_4_;
  auVar213._4_4_ = uVar69;
  auVar213._0_4_ = uVar69;
  auVar213._8_4_ = uVar69;
  auVar213._12_4_ = uVar69;
  auVar134 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar213);
  auVar21 = vmovlhps_avx(auVar114,auVar269);
  auVar174 = vmovlhps_avx(auVar73,auVar23);
  auVar22 = vmovlhps_avx(auVar72,auVar108);
  _local_3a0 = vmovlhps_avx(auVar107,auVar134);
  auVar15 = vminps_avx(auVar21,auVar174);
  auVar18 = vminps_avx(auVar22,_local_3a0);
  auVar19 = vminps_avx(auVar15,auVar18);
  auVar15 = vmaxps_avx(auVar21,auVar174);
  auVar18 = vmaxps_avx(auVar22,_local_3a0);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vshufpd_avx(auVar19,auVar19,3);
  auVar19 = vminps_avx(auVar19,auVar18);
  auVar18 = vshufpd_avx(auVar15,auVar15,3);
  auVar18 = vmaxps_avx(auVar15,auVar18);
  auVar15 = vandps_avx(local_4c0,auVar19);
  auVar18 = vandps_avx(auVar18,local_4c0);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar18,auVar15);
  local_1c0 = auVar15._0_4_ * 9.536743e-07;
  auVar246._8_8_ = auVar114._0_8_;
  auVar246._0_8_ = auVar114._0_8_;
  auVar270._8_8_ = auVar73._0_8_;
  auVar270._0_8_ = auVar73._0_8_;
  auVar308._0_8_ = auVar72._0_8_;
  auVar308._8_8_ = auVar308._0_8_;
  auVar317._0_8_ = auVar107._0_8_;
  auVar317._8_8_ = auVar317._0_8_;
  local_3b0 = ZEXT416((uint)local_1c0);
  local_4d0 = 0x80000000;
  uStack_4cc = 0x80000000;
  uStack_4c8 = 0x80000000;
  uStack_4c4 = 0x80000000;
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar59;
  uStack_31c = uVar59;
  uStack_318 = uVar59;
  uStack_314 = uVar59;
  uStack_310 = uVar59;
  uStack_30c = uVar59;
  uStack_308 = uVar59;
  uStack_304 = uVar59;
  local_340 = uVar7;
  uStack_33c = uVar7;
  uStack_338 = uVar7;
  uStack_334 = uVar7;
  uStack_330 = uVar7;
  uStack_32c = uVar7;
  uStack_328 = uVar7;
  uStack_324 = uVar7;
  uVar61 = 0;
  fVar70 = *(float *)(ray + k * 4 + 0x60);
  auVar15 = vsubps_avx(auVar174,auVar21);
  auVar18 = vsubps_avx(auVar22,auVar174);
  local_390 = vsubps_avx(_local_3a0,auVar22);
  local_430 = vsubps_avx(_local_530,local_500);
  local_440 = vsubps_avx(_local_540,auVar17);
  local_450 = vsubps_avx(auVar20,local_510);
  _local_460 = vsubps_avx(auVar171,local_520);
  auVar82 = ZEXT816(0x3f80000000000000);
  local_420 = auVar82;
LAB_0123f2fd:
  auVar19 = vshufps_avx(auVar82,auVar82,0x50);
  auVar326._8_4_ = 0x3f800000;
  auVar326._0_8_ = 0x3f8000003f800000;
  auVar326._12_4_ = 0x3f800000;
  auVar329._16_4_ = 0x3f800000;
  auVar329._0_16_ = auVar326;
  auVar329._20_4_ = 0x3f800000;
  auVar329._24_4_ = 0x3f800000;
  auVar329._28_4_ = 0x3f800000;
  auVar114 = vsubps_avx(auVar326,auVar19);
  fVar103 = auVar19._0_4_;
  fVar169 = auVar269._0_4_;
  auVar83._0_4_ = fVar169 * fVar103;
  fVar100 = auVar19._4_4_;
  fVar184 = auVar269._4_4_;
  auVar83._4_4_ = fVar184 * fVar100;
  fVar71 = auVar19._8_4_;
  auVar83._8_4_ = fVar169 * fVar71;
  fVar101 = auVar19._12_4_;
  auVar83._12_4_ = fVar184 * fVar101;
  fVar201 = auVar23._0_4_;
  auVar214._0_4_ = fVar201 * fVar103;
  fVar234 = auVar23._4_4_;
  auVar214._4_4_ = fVar234 * fVar100;
  auVar214._8_4_ = fVar201 * fVar71;
  auVar214._12_4_ = fVar234 * fVar101;
  fVar236 = auVar108._0_4_;
  auVar178._0_4_ = fVar236 * fVar103;
  fVar238 = auVar108._4_4_;
  auVar178._4_4_ = fVar238 * fVar100;
  auVar178._8_4_ = fVar236 * fVar71;
  auVar178._12_4_ = fVar238 * fVar101;
  fVar185 = auVar134._0_4_;
  auVar139._0_4_ = fVar185 * fVar103;
  fVar200 = auVar134._4_4_;
  auVar139._4_4_ = fVar200 * fVar100;
  auVar139._8_4_ = fVar185 * fVar71;
  auVar139._12_4_ = fVar200 * fVar101;
  auVar107 = vfmadd231ps_fma(auVar83,auVar114,auVar246);
  auVar289 = vfmadd231ps_fma(auVar214,auVar114,auVar270);
  auVar105 = vfmadd231ps_fma(auVar178,auVar114,auVar308);
  auVar106 = vfmadd231ps_fma(auVar139,auVar317,auVar114);
  auVar19 = vmovshdup_avx(local_420);
  fVar103 = local_420._0_4_;
  fStack_288 = (auVar19._0_4_ - fVar103) * 0.04761905;
  auVar266._4_4_ = fVar103;
  auVar266._0_4_ = fVar103;
  auVar266._8_4_ = fVar103;
  auVar266._12_4_ = fVar103;
  auVar266._16_4_ = fVar103;
  auVar266._20_4_ = fVar103;
  auVar266._24_4_ = fVar103;
  auVar266._28_4_ = fVar103;
  auVar130._0_8_ = auVar19._0_8_;
  auVar130._8_8_ = auVar130._0_8_;
  auVar130._16_8_ = auVar130._0_8_;
  auVar130._24_8_ = auVar130._0_8_;
  auVar95 = vsubps_avx(auVar130,auVar266);
  uVar69 = auVar107._0_4_;
  auVar321._4_4_ = uVar69;
  auVar321._0_4_ = uVar69;
  auVar321._8_4_ = uVar69;
  auVar321._12_4_ = uVar69;
  auVar321._16_4_ = uVar69;
  auVar321._20_4_ = uVar69;
  auVar321._24_4_ = uVar69;
  auVar321._28_4_ = uVar69;
  auVar19 = vmovshdup_avx(auVar107);
  uVar104 = auVar19._0_8_;
  auVar314._8_8_ = uVar104;
  auVar314._0_8_ = uVar104;
  auVar314._16_8_ = uVar104;
  auVar314._24_8_ = uVar104;
  fVar220 = auVar289._0_4_;
  auVar295._4_4_ = fVar220;
  auVar295._0_4_ = fVar220;
  auVar295._8_4_ = fVar220;
  auVar295._12_4_ = fVar220;
  auVar295._16_4_ = fVar220;
  auVar295._20_4_ = fVar220;
  auVar295._24_4_ = fVar220;
  auVar295._28_4_ = fVar220;
  auVar114 = vmovshdup_avx(auVar289);
  auVar131._0_8_ = auVar114._0_8_;
  auVar131._8_8_ = auVar131._0_8_;
  auVar131._16_8_ = auVar131._0_8_;
  auVar131._24_8_ = auVar131._0_8_;
  fVar168 = auVar105._0_4_;
  auVar231._4_4_ = fVar168;
  auVar231._0_4_ = fVar168;
  auVar231._8_4_ = fVar168;
  auVar231._12_4_ = fVar168;
  auVar231._16_4_ = fVar168;
  auVar231._20_4_ = fVar168;
  auVar231._24_4_ = fVar168;
  auVar231._28_4_ = fVar168;
  auVar73 = vmovshdup_avx(auVar105);
  auVar252._0_8_ = auVar73._0_8_;
  auVar252._8_8_ = auVar252._0_8_;
  auVar252._16_8_ = auVar252._0_8_;
  auVar252._24_8_ = auVar252._0_8_;
  fVar167 = auVar106._0_4_;
  auVar72 = vmovshdup_avx(auVar106);
  auVar281 = vfmadd132ps_fma(auVar95,auVar266,_DAT_01f7b040);
  auVar95 = vsubps_avx(auVar329,ZEXT1632(auVar281));
  fVar103 = auVar281._0_4_;
  fVar100 = auVar281._4_4_;
  auVar25._4_4_ = fVar220 * fVar100;
  auVar25._0_4_ = fVar220 * fVar103;
  fVar71 = auVar281._8_4_;
  auVar25._8_4_ = fVar220 * fVar71;
  fVar101 = auVar281._12_4_;
  auVar25._12_4_ = fVar220 * fVar101;
  auVar25._16_4_ = fVar220 * 0.0;
  auVar25._20_4_ = fVar220 * 0.0;
  auVar25._24_4_ = fVar220 * 0.0;
  auVar25._28_4_ = 0x3f800000;
  auVar281 = vfmadd231ps_fma(auVar25,auVar95,auVar321);
  fVar147 = auVar114._0_4_;
  fVar146 = auVar114._4_4_;
  auVar24._4_4_ = fVar146 * fVar100;
  auVar24._0_4_ = fVar147 * fVar103;
  auVar24._8_4_ = fVar147 * fVar71;
  auVar24._12_4_ = fVar146 * fVar101;
  auVar24._16_4_ = fVar147 * 0.0;
  auVar24._20_4_ = fVar146 * 0.0;
  auVar24._24_4_ = fVar147 * 0.0;
  auVar24._28_4_ = uVar69;
  auVar148 = vfmadd231ps_fma(auVar24,auVar95,auVar314);
  auVar16._4_4_ = fVar168 * fVar100;
  auVar16._0_4_ = fVar168 * fVar103;
  auVar16._8_4_ = fVar168 * fVar71;
  auVar16._12_4_ = fVar168 * fVar101;
  auVar16._16_4_ = fVar168 * 0.0;
  auVar16._20_4_ = fVar168 * 0.0;
  auVar16._24_4_ = fVar168 * 0.0;
  auVar16._28_4_ = auVar19._4_4_;
  auVar149 = vfmadd231ps_fma(auVar16,auVar95,auVar295);
  fVar147 = auVar73._0_4_;
  fVar146 = auVar73._4_4_;
  auVar26._4_4_ = fVar146 * fVar100;
  auVar26._0_4_ = fVar147 * fVar103;
  auVar26._8_4_ = fVar147 * fVar71;
  auVar26._12_4_ = fVar146 * fVar101;
  auVar26._16_4_ = fVar147 * 0.0;
  auVar26._20_4_ = fVar146 * 0.0;
  auVar26._24_4_ = fVar147 * 0.0;
  auVar26._28_4_ = fVar220;
  auVar158 = vfmadd231ps_fma(auVar26,auVar95,auVar131);
  auVar19 = vshufps_avx(auVar107,auVar107,0xaa);
  uStack_6f8 = auVar19._0_8_;
  local_700 = (undefined1  [8])uStack_6f8;
  uStack_6f0 = uStack_6f8;
  uStack_6e8 = uStack_6f8;
  auVar114 = vshufps_avx(auVar107,auVar107,0xff);
  uStack_778 = auVar114._0_8_;
  local_780 = (undefined1  [8])uStack_778;
  uStack_770 = uStack_778;
  uStack_768 = uStack_778;
  auVar27._4_4_ = fVar167 * fVar100;
  auVar27._0_4_ = fVar167 * fVar103;
  auVar27._8_4_ = fVar167 * fVar71;
  auVar27._12_4_ = fVar167 * fVar101;
  auVar27._16_4_ = fVar167 * 0.0;
  auVar27._20_4_ = fVar167 * 0.0;
  auVar27._24_4_ = fVar167 * 0.0;
  auVar27._28_4_ = fVar167;
  auVar107 = vfmadd231ps_fma(auVar27,auVar95,auVar231);
  auVar114 = vshufps_avx(auVar289,auVar289,0xaa);
  auVar232._0_8_ = auVar114._0_8_;
  auVar232._8_8_ = auVar232._0_8_;
  auVar232._16_8_ = auVar232._0_8_;
  auVar232._24_8_ = auVar232._0_8_;
  auVar73 = vshufps_avx(auVar289,auVar289,0xff);
  local_640._8_8_ = auVar73._0_8_;
  local_640._0_8_ = local_640._8_8_;
  local_640._16_8_ = local_640._8_8_;
  local_640._24_8_ = local_640._8_8_;
  fVar147 = auVar72._0_4_;
  fVar146 = auVar72._4_4_;
  auVar28._4_4_ = fVar146 * fVar100;
  auVar28._0_4_ = fVar147 * fVar103;
  auVar28._8_4_ = fVar147 * fVar71;
  auVar28._12_4_ = fVar146 * fVar101;
  auVar28._16_4_ = fVar147 * 0.0;
  auVar28._20_4_ = fVar146 * 0.0;
  auVar28._24_4_ = fVar147 * 0.0;
  auVar28._28_4_ = auVar19._4_4_;
  auVar170 = vfmadd231ps_fma(auVar28,auVar95,auVar252);
  auVar29._28_4_ = fVar146;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar149._12_4_ * fVar101,
                          CONCAT48(auVar149._8_4_ * fVar71,
                                   CONCAT44(auVar149._4_4_ * fVar100,auVar149._0_4_ * fVar103))));
  auVar281 = vfmadd231ps_fma(auVar29,auVar95,ZEXT1632(auVar281));
  fVar147 = auVar73._4_4_;
  auVar30._28_4_ = fVar147;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar158._12_4_ * fVar101,
                          CONCAT48(auVar158._8_4_ * fVar71,
                                   CONCAT44(auVar158._4_4_ * fVar100,auVar158._0_4_ * fVar103))));
  auVar148 = vfmadd231ps_fma(auVar30,auVar95,ZEXT1632(auVar148));
  auVar19 = vshufps_avx(auVar105,auVar105,0xaa);
  uVar104 = auVar19._0_8_;
  auVar219._8_8_ = uVar104;
  auVar219._0_8_ = uVar104;
  auVar219._16_8_ = uVar104;
  auVar219._24_8_ = uVar104;
  auVar72 = vshufps_avx(auVar105,auVar105,0xff);
  uVar104 = auVar72._0_8_;
  auVar330._8_8_ = uVar104;
  auVar330._0_8_ = uVar104;
  auVar330._16_8_ = uVar104;
  auVar330._24_8_ = uVar104;
  auVar105 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * fVar101,
                                                CONCAT48(auVar107._8_4_ * fVar71,
                                                         CONCAT44(auVar107._4_4_ * fVar100,
                                                                  auVar107._0_4_ * fVar103)))),
                             auVar95,ZEXT1632(auVar149));
  auVar107 = vshufps_avx(auVar106,auVar106,0xaa);
  auVar289 = vshufps_avx(auVar106,auVar106,0xff);
  auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar101 * auVar170._12_4_,
                                                CONCAT48(fVar71 * auVar170._8_4_,
                                                         CONCAT44(fVar100 * auVar170._4_4_,
                                                                  fVar103 * auVar170._0_4_)))),
                             auVar95,ZEXT1632(auVar158));
  auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar101 * auVar105._12_4_,
                                                CONCAT48(fVar71 * auVar105._8_4_,
                                                         CONCAT44(fVar100 * auVar105._4_4_,
                                                                  fVar103 * auVar105._0_4_)))),
                             auVar95,ZEXT1632(auVar281));
  auVar25 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar281));
  auVar105 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar101 * auVar106._12_4_,
                                                CONCAT48(fVar71 * auVar106._8_4_,
                                                         CONCAT44(fVar100 * auVar106._4_4_,
                                                                  fVar103 * auVar106._0_4_)))),
                             auVar95,ZEXT1632(auVar148));
  auVar96 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar148));
  fStack_604 = auVar96._28_4_;
  auVar296._0_4_ = fStack_288 * auVar25._0_4_ * 3.0;
  auVar296._4_4_ = fStack_288 * auVar25._4_4_ * 3.0;
  auVar296._8_4_ = fStack_288 * auVar25._8_4_ * 3.0;
  auVar296._12_4_ = fStack_288 * auVar25._12_4_ * 3.0;
  auVar296._16_4_ = fStack_288 * auVar25._16_4_ * 3.0;
  auVar296._20_4_ = fStack_288 * auVar25._20_4_ * 3.0;
  auVar296._24_4_ = fStack_288 * auVar25._24_4_ * 3.0;
  auVar296._28_4_ = 0;
  local_620._0_4_ = fStack_288 * auVar96._0_4_ * 3.0;
  local_620._4_4_ = fStack_288 * auVar96._4_4_ * 3.0;
  fStack_618 = fStack_288 * auVar96._8_4_ * 3.0;
  fStack_614 = fStack_288 * auVar96._12_4_ * 3.0;
  fStack_610 = fStack_288 * auVar96._16_4_ * 3.0;
  fStack_60c = fStack_288 * auVar96._20_4_ * 3.0;
  fStack_608 = fStack_288 * auVar96._24_4_ * 3.0;
  fVar146 = auVar114._0_4_;
  fVar167 = auVar114._4_4_;
  auVar297._4_4_ = fVar167 * fVar100;
  auVar297._0_4_ = fVar146 * fVar103;
  auVar297._8_4_ = fVar146 * fVar71;
  auVar297._12_4_ = fVar167 * fVar101;
  auVar297._16_4_ = fVar146 * 0.0;
  auVar297._20_4_ = fVar167 * 0.0;
  auVar297._24_4_ = fVar146 * 0.0;
  auVar297._28_4_ = fStack_604;
  auVar114 = vfmadd231ps_fma(auVar297,auVar95,_local_700);
  fVar146 = auVar73._0_4_;
  auVar31._4_4_ = fVar147 * fVar100;
  auVar31._0_4_ = fVar146 * fVar103;
  auVar31._8_4_ = fVar146 * fVar71;
  auVar31._12_4_ = fVar147 * fVar101;
  auVar31._16_4_ = fVar146 * 0.0;
  auVar31._20_4_ = fVar147 * 0.0;
  auVar31._24_4_ = fVar146 * 0.0;
  auVar31._28_4_ = 0;
  auVar73 = vfmadd231ps_fma(auVar31,auVar95,_local_780);
  fVar147 = auVar19._0_4_;
  fVar146 = auVar19._4_4_;
  auVar32._4_4_ = fVar146 * fVar100;
  auVar32._0_4_ = fVar147 * fVar103;
  auVar32._8_4_ = fVar147 * fVar71;
  auVar32._12_4_ = fVar146 * fVar101;
  auVar32._16_4_ = fVar147 * 0.0;
  auVar32._20_4_ = fVar146 * 0.0;
  auVar32._24_4_ = fVar147 * 0.0;
  auVar32._28_4_ = auVar25._28_4_;
  auVar19 = vfmadd231ps_fma(auVar32,auVar95,auVar232);
  fVar147 = auVar72._0_4_;
  fVar168 = auVar72._4_4_;
  auVar33._4_4_ = fVar168 * fVar100;
  auVar33._0_4_ = fVar147 * fVar103;
  auVar33._8_4_ = fVar147 * fVar71;
  auVar33._12_4_ = fVar168 * fVar101;
  auVar33._16_4_ = fVar147 * 0.0;
  auVar33._20_4_ = fVar168 * 0.0;
  auVar33._24_4_ = fVar147 * 0.0;
  auVar33._28_4_ = fVar167;
  auVar72 = vfmadd231ps_fma(auVar33,auVar95,local_640);
  auVar26 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar149));
  fVar147 = auVar107._0_4_;
  fVar146 = auVar107._4_4_;
  auVar34._4_4_ = fVar146 * fVar100;
  auVar34._0_4_ = fVar147 * fVar103;
  auVar34._8_4_ = fVar147 * fVar71;
  auVar34._12_4_ = fVar146 * fVar101;
  auVar34._16_4_ = fVar147 * 0.0;
  auVar34._20_4_ = fVar146 * 0.0;
  auVar34._24_4_ = fVar147 * 0.0;
  auVar34._28_4_ = fVar146;
  auVar107 = vfmadd231ps_fma(auVar34,auVar95,auVar219);
  auVar27 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar105));
  fVar147 = auVar289._0_4_;
  fVar146 = auVar289._4_4_;
  auVar35._4_4_ = fVar146 * fVar100;
  auVar35._0_4_ = fVar147 * fVar103;
  auVar35._8_4_ = fVar147 * fVar71;
  auVar35._12_4_ = fVar146 * fVar101;
  auVar35._16_4_ = fVar147 * 0.0;
  auVar35._20_4_ = fVar146 * 0.0;
  auVar35._24_4_ = fVar147 * 0.0;
  auVar35._28_4_ = fVar146;
  auVar289 = vfmadd231ps_fma(auVar35,auVar95,auVar330);
  auVar36._28_4_ = fVar168;
  auVar36._0_28_ =
       ZEXT1628(CONCAT412(auVar19._12_4_ * fVar101,
                          CONCAT48(auVar19._8_4_ * fVar71,
                                   CONCAT44(auVar19._4_4_ * fVar100,auVar19._0_4_ * fVar103))));
  auVar114 = vfmadd231ps_fma(auVar36,auVar95,ZEXT1632(auVar114));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar101 * auVar72._12_4_,
                                               CONCAT48(fVar71 * auVar72._8_4_,
                                                        CONCAT44(fVar100 * auVar72._4_4_,
                                                                 fVar103 * auVar72._0_4_)))),auVar95
                            ,ZEXT1632(auVar73));
  auVar132._0_4_ = auVar149._0_4_ + auVar296._0_4_;
  auVar132._4_4_ = auVar149._4_4_ + auVar296._4_4_;
  auVar132._8_4_ = auVar149._8_4_ + auVar296._8_4_;
  auVar132._12_4_ = auVar149._12_4_ + auVar296._12_4_;
  auVar132._16_4_ = auVar296._16_4_ + 0.0;
  auVar132._20_4_ = auVar296._20_4_ + 0.0;
  auVar132._24_4_ = auVar296._24_4_ + 0.0;
  auVar132._28_4_ = 0;
  auVar19 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * fVar101,
                                               CONCAT48(auVar107._8_4_ * fVar71,
                                                        CONCAT44(auVar107._4_4_ * fVar100,
                                                                 auVar107._0_4_ * fVar103)))),
                            auVar95,ZEXT1632(auVar19));
  auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar289._12_4_ * fVar101,
                                               CONCAT48(auVar289._8_4_ * fVar71,
                                                        CONCAT44(auVar289._4_4_ * fVar100,
                                                                 auVar289._0_4_ * fVar103)))),
                            auVar95,ZEXT1632(auVar72));
  auVar107 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar101 * auVar19._12_4_,
                                                CONCAT48(fVar71 * auVar19._8_4_,
                                                         CONCAT44(fVar100 * auVar19._4_4_,
                                                                  fVar103 * auVar19._0_4_)))),
                             auVar95,ZEXT1632(auVar114));
  auVar289 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar72._12_4_ * fVar101,
                                                CONCAT48(auVar72._8_4_ * fVar71,
                                                         CONCAT44(auVar72._4_4_ * fVar100,
                                                                  auVar72._0_4_ * fVar103)))),
                             ZEXT1632(auVar73),auVar95);
  auVar95 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar114));
  auVar25 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar73));
  auVar322._0_4_ = fStack_288 * auVar95._0_4_ * 3.0;
  auVar322._4_4_ = fStack_288 * auVar95._4_4_ * 3.0;
  auVar322._8_4_ = fStack_288 * auVar95._8_4_ * 3.0;
  auVar322._12_4_ = fStack_288 * auVar95._12_4_ * 3.0;
  auVar322._16_4_ = fStack_288 * auVar95._16_4_ * 3.0;
  auVar322._20_4_ = fStack_288 * auVar95._20_4_ * 3.0;
  auVar322._24_4_ = fStack_288 * auVar95._24_4_ * 3.0;
  auVar322._28_4_ = 0;
  local_2a0 = fStack_288 * auVar25._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar25._4_4_ * 3.0;
  auVar37._4_4_ = fStack_29c;
  auVar37._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar25._8_4_ * 3.0;
  auVar37._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar25._12_4_ * 3.0;
  auVar37._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar25._16_4_ * 3.0;
  auVar37._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar25._20_4_ * 3.0;
  auVar37._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar25._24_4_ * 3.0;
  auVar37._24_4_ = fStack_288;
  auVar37._28_4_ = 0x40400000;
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar107));
  auVar29 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar289));
  auVar95 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar149));
  auVar25 = vsubps_avx(ZEXT1632(auVar289),ZEXT1632(auVar105));
  auVar96 = vsubps_avx(auVar28,auVar26);
  fVar220 = auVar95._0_4_ + auVar96._0_4_;
  fVar235 = auVar95._4_4_ + auVar96._4_4_;
  fVar237 = auVar95._8_4_ + auVar96._8_4_;
  fVar239 = auVar95._12_4_ + auVar96._12_4_;
  fVar240 = auVar95._16_4_ + auVar96._16_4_;
  fVar241 = auVar95._20_4_ + auVar96._20_4_;
  fVar242 = auVar95._24_4_ + auVar96._24_4_;
  auVar24 = vsubps_avx(auVar29,auVar27);
  auVar97._0_4_ = auVar25._0_4_ + auVar24._0_4_;
  auVar97._4_4_ = auVar25._4_4_ + auVar24._4_4_;
  auVar97._8_4_ = auVar25._8_4_ + auVar24._8_4_;
  auVar97._12_4_ = auVar25._12_4_ + auVar24._12_4_;
  auVar97._16_4_ = auVar25._16_4_ + auVar24._16_4_;
  auVar97._20_4_ = auVar25._20_4_ + auVar24._20_4_;
  auVar97._24_4_ = auVar25._24_4_ + auVar24._24_4_;
  auVar97._28_4_ = auVar25._28_4_ + auVar24._28_4_;
  local_240 = ZEXT1632(auVar105);
  fVar103 = auVar105._0_4_;
  local_2c0 = (float)local_620._0_4_ + fVar103;
  fVar100 = auVar105._4_4_;
  fStack_2bc = (float)local_620._4_4_ + fVar100;
  fVar71 = auVar105._8_4_;
  fStack_2b8 = fStack_618 + fVar71;
  fVar101 = auVar105._12_4_;
  fStack_2b4 = fStack_614 + fVar101;
  fStack_2b0 = fStack_610 + 0.0;
  fStack_2ac = fStack_60c + 0.0;
  fStack_2a8 = fStack_608 + 0.0;
  local_200 = ZEXT1632(auVar149);
  auVar25 = vsubps_avx(local_200,auVar296);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar25 = vsubps_avx(local_240,_local_620);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar25);
  local_260._0_4_ = auVar107._0_4_ + auVar322._0_4_;
  local_260._4_4_ = auVar107._4_4_ + auVar322._4_4_;
  local_260._8_4_ = auVar107._8_4_ + auVar322._8_4_;
  local_260._12_4_ = auVar107._12_4_ + auVar322._12_4_;
  local_260._16_4_ = auVar322._16_4_ + 0.0;
  local_260._20_4_ = auVar322._20_4_ + 0.0;
  local_260._24_4_ = auVar322._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar297 = ZEXT1632(auVar107);
  auVar25 = vsubps_avx(auVar297,auVar322);
  auVar30 = vpermps_avx2(_DAT_01fb7720,auVar25);
  fVar147 = auVar289._0_4_;
  local_2a0 = fVar147 + local_2a0;
  fVar146 = auVar289._4_4_;
  fStack_29c = fVar146 + fStack_29c;
  fVar167 = auVar289._8_4_;
  fStack_298 = fVar167 + fStack_298;
  fVar168 = auVar289._12_4_;
  fStack_294 = fVar168 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar25 = vsubps_avx(ZEXT1632(auVar289),auVar37);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar38._4_4_ = fVar100 * fVar235;
  auVar38._0_4_ = fVar103 * fVar220;
  auVar38._8_4_ = fVar71 * fVar237;
  auVar38._12_4_ = fVar101 * fVar239;
  auVar38._16_4_ = fVar240 * 0.0;
  auVar38._20_4_ = fVar241 * 0.0;
  auVar38._24_4_ = fVar242 * 0.0;
  auVar38._28_4_ = auVar25._28_4_;
  auVar19 = vfnmadd231ps_fma(auVar38,local_200,auVar97);
  fStack_2a4 = fStack_604 + 0.0;
  auVar39._4_4_ = fStack_2bc * fVar235;
  auVar39._0_4_ = local_2c0 * fVar220;
  auVar39._8_4_ = fStack_2b8 * fVar237;
  auVar39._12_4_ = fStack_2b4 * fVar239;
  auVar39._16_4_ = fStack_2b0 * fVar240;
  auVar39._20_4_ = fStack_2ac * fVar241;
  auVar39._24_4_ = fStack_2a8 * fVar242;
  auVar39._28_4_ = 0;
  auVar114 = vfnmadd231ps_fma(auVar39,auVar97,auVar132);
  auVar40._4_4_ = local_2e0._4_4_ * fVar235;
  auVar40._0_4_ = local_2e0._0_4_ * fVar220;
  auVar40._8_4_ = local_2e0._8_4_ * fVar237;
  auVar40._12_4_ = local_2e0._12_4_ * fVar239;
  auVar40._16_4_ = local_2e0._16_4_ * fVar240;
  auVar40._20_4_ = local_2e0._20_4_ * fVar241;
  auVar40._24_4_ = local_2e0._24_4_ * fVar242;
  auVar40._28_4_ = fStack_604 + 0.0;
  auVar73 = vfnmadd231ps_fma(auVar40,local_220,auVar97);
  local_780._0_4_ = auVar27._0_4_;
  local_780._4_4_ = auVar27._4_4_;
  uStack_778._0_4_ = auVar27._8_4_;
  uStack_778._4_4_ = auVar27._12_4_;
  uStack_770._0_4_ = auVar27._16_4_;
  uStack_770._4_4_ = auVar27._20_4_;
  uStack_768._0_4_ = auVar27._24_4_;
  uStack_768._4_4_ = auVar27._28_4_;
  auVar41._4_4_ = (float)local_780._4_4_ * fVar235;
  auVar41._0_4_ = (float)local_780._0_4_ * fVar220;
  auVar41._8_4_ = (float)uStack_778 * fVar237;
  auVar41._12_4_ = uStack_778._4_4_ * fVar239;
  auVar41._16_4_ = (float)uStack_770 * fVar240;
  auVar41._20_4_ = uStack_770._4_4_ * fVar241;
  auVar41._24_4_ = (float)uStack_768 * fVar242;
  auVar41._28_4_ = uStack_768._4_4_;
  auVar72 = vfnmadd231ps_fma(auVar41,auVar26,auVar97);
  auVar253._0_4_ = fVar147 * fVar220;
  auVar253._4_4_ = fVar146 * fVar235;
  auVar253._8_4_ = fVar167 * fVar237;
  auVar253._12_4_ = fVar168 * fVar239;
  auVar253._16_4_ = fVar240 * 0.0;
  auVar253._20_4_ = fVar241 * 0.0;
  auVar253._24_4_ = fVar242 * 0.0;
  auVar253._28_4_ = 0;
  auVar107 = vfnmadd231ps_fma(auVar253,auVar297,auVar97);
  uStack_284 = 0x40400000;
  auVar42._4_4_ = fStack_29c * fVar235;
  auVar42._0_4_ = local_2a0 * fVar220;
  auVar42._8_4_ = fStack_298 * fVar237;
  auVar42._12_4_ = fStack_294 * fVar239;
  auVar42._16_4_ = fStack_290 * fVar240;
  auVar42._20_4_ = fStack_28c * fVar241;
  auVar42._24_4_ = fStack_288 * fVar242;
  auVar42._28_4_ = auVar26._28_4_;
  auVar105 = vfnmadd231ps_fma(auVar42,local_260,auVar97);
  auVar43._4_4_ = local_280._4_4_ * fVar235;
  auVar43._0_4_ = local_280._0_4_ * fVar220;
  auVar43._8_4_ = local_280._8_4_ * fVar237;
  auVar43._12_4_ = local_280._12_4_ * fVar239;
  auVar43._16_4_ = local_280._16_4_ * fVar240;
  auVar43._20_4_ = local_280._20_4_ * fVar241;
  auVar43._24_4_ = local_280._24_4_ * fVar242;
  auVar43._28_4_ = local_280._28_4_;
  auVar106 = vfnmadd231ps_fma(auVar43,auVar30,auVar97);
  auVar44._4_4_ = auVar29._4_4_ * fVar235;
  auVar44._0_4_ = auVar29._0_4_ * fVar220;
  auVar44._8_4_ = auVar29._8_4_ * fVar237;
  auVar44._12_4_ = auVar29._12_4_ * fVar239;
  auVar44._16_4_ = auVar29._16_4_ * fVar240;
  auVar44._20_4_ = auVar29._20_4_ * fVar241;
  auVar44._24_4_ = auVar29._24_4_ * fVar242;
  auVar44._28_4_ = auVar95._28_4_ + auVar96._28_4_;
  auVar281 = vfnmadd231ps_fma(auVar44,auVar28,auVar97);
  auVar25 = vminps_avx(ZEXT1632(auVar19),ZEXT1632(auVar114));
  auVar95 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar114));
  auVar96 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar72));
  auVar96 = vminps_avx(auVar25,auVar96);
  auVar25 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar72));
  auVar95 = vmaxps_avx(auVar95,auVar25);
  auVar24 = vminps_avx(ZEXT1632(auVar107),ZEXT1632(auVar105));
  auVar25 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar105));
  auVar16 = vminps_avx(ZEXT1632(auVar106),ZEXT1632(auVar281));
  auVar24 = vminps_avx(auVar24,auVar16);
  auVar24 = vminps_avx(auVar96,auVar24);
  auVar96 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar281));
  auVar25 = vmaxps_avx(auVar25,auVar96);
  auVar25 = vmaxps_avx(auVar95,auVar25);
  auVar55._4_4_ = fStack_1bc;
  auVar55._0_4_ = local_1c0;
  auVar55._8_4_ = fStack_1b8;
  auVar55._12_4_ = fStack_1b4;
  auVar55._16_4_ = fStack_1b0;
  auVar55._20_4_ = fStack_1ac;
  auVar55._24_4_ = fStack_1a8;
  auVar55._28_4_ = fStack_1a4;
  auVar95 = vcmpps_avx(auVar24,auVar55,2);
  auVar54._4_4_ = fStack_1dc;
  auVar54._0_4_ = local_1e0;
  auVar54._8_4_ = fStack_1d8;
  auVar54._12_4_ = fStack_1d4;
  auVar54._16_4_ = fStack_1d0;
  auVar54._20_4_ = fStack_1cc;
  auVar54._24_4_ = fStack_1c8;
  auVar54._28_4_ = fStack_1c4;
  auVar25 = vcmpps_avx(auVar25,auVar54,5);
  auVar95 = vandps_avx(auVar25,auVar95);
  auVar25 = local_300 & auVar95;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar25 = vsubps_avx(auVar26,local_200);
    auVar96 = vsubps_avx(auVar28,auVar297);
    fVar235 = auVar25._0_4_ + auVar96._0_4_;
    fVar237 = auVar25._4_4_ + auVar96._4_4_;
    fVar239 = auVar25._8_4_ + auVar96._8_4_;
    fVar240 = auVar25._12_4_ + auVar96._12_4_;
    fVar241 = auVar25._16_4_ + auVar96._16_4_;
    fVar242 = auVar25._20_4_ + auVar96._20_4_;
    fVar102 = auVar25._24_4_ + auVar96._24_4_;
    auVar24 = vsubps_avx(auVar27,local_240);
    auVar16 = vsubps_avx(auVar29,ZEXT1632(auVar289));
    auVar133._0_4_ = auVar24._0_4_ + auVar16._0_4_;
    auVar133._4_4_ = auVar24._4_4_ + auVar16._4_4_;
    auVar133._8_4_ = auVar24._8_4_ + auVar16._8_4_;
    auVar133._12_4_ = auVar24._12_4_ + auVar16._12_4_;
    auVar133._16_4_ = auVar24._16_4_ + auVar16._16_4_;
    auVar133._20_4_ = auVar24._20_4_ + auVar16._20_4_;
    auVar133._24_4_ = auVar24._24_4_ + auVar16._24_4_;
    fVar220 = auVar16._28_4_;
    auVar133._28_4_ = auVar24._28_4_ + fVar220;
    auVar45._4_4_ = fVar100 * fVar237;
    auVar45._0_4_ = fVar103 * fVar235;
    auVar45._8_4_ = fVar71 * fVar239;
    auVar45._12_4_ = fVar101 * fVar240;
    auVar45._16_4_ = fVar241 * 0.0;
    auVar45._20_4_ = fVar242 * 0.0;
    auVar45._24_4_ = fVar102 * 0.0;
    auVar45._28_4_ = auVar29._28_4_;
    auVar107 = vfnmadd231ps_fma(auVar45,auVar133,local_200);
    auVar46._4_4_ = fVar237 * fStack_2bc;
    auVar46._0_4_ = fVar235 * local_2c0;
    auVar46._8_4_ = fVar239 * fStack_2b8;
    auVar46._12_4_ = fVar240 * fStack_2b4;
    auVar46._16_4_ = fVar241 * fStack_2b0;
    auVar46._20_4_ = fVar242 * fStack_2ac;
    auVar46._24_4_ = fVar102 * fStack_2a8;
    auVar46._28_4_ = 0;
    auVar19 = vfnmadd213ps_fma(auVar132,auVar133,auVar46);
    auVar47._4_4_ = fVar237 * local_2e0._4_4_;
    auVar47._0_4_ = fVar235 * local_2e0._0_4_;
    auVar47._8_4_ = fVar239 * local_2e0._8_4_;
    auVar47._12_4_ = fVar240 * local_2e0._12_4_;
    auVar47._16_4_ = fVar241 * local_2e0._16_4_;
    auVar47._20_4_ = fVar242 * local_2e0._20_4_;
    auVar47._24_4_ = fVar102 * local_2e0._24_4_;
    auVar47._28_4_ = 0;
    auVar114 = vfnmadd213ps_fma(local_220,auVar133,auVar47);
    auVar48._4_4_ = (float)local_780._4_4_ * fVar237;
    auVar48._0_4_ = (float)local_780._0_4_ * fVar235;
    auVar48._8_4_ = (float)uStack_778 * fVar239;
    auVar48._12_4_ = uStack_778._4_4_ * fVar240;
    auVar48._16_4_ = (float)uStack_770 * fVar241;
    auVar48._20_4_ = uStack_770._4_4_ * fVar242;
    auVar48._24_4_ = (float)uStack_768 * fVar102;
    auVar48._28_4_ = 0;
    auVar289 = vfnmadd231ps_fma(auVar48,auVar133,auVar26);
    auVar165._0_4_ = fVar147 * fVar235;
    auVar165._4_4_ = fVar146 * fVar237;
    auVar165._8_4_ = fVar167 * fVar239;
    auVar165._12_4_ = fVar168 * fVar240;
    auVar165._16_4_ = fVar241 * 0.0;
    auVar165._20_4_ = fVar242 * 0.0;
    auVar165._24_4_ = fVar102 * 0.0;
    auVar165._28_4_ = 0;
    auVar105 = vfnmadd231ps_fma(auVar165,auVar133,auVar297);
    auVar49._4_4_ = fVar237 * fStack_29c;
    auVar49._0_4_ = fVar235 * local_2a0;
    auVar49._8_4_ = fVar239 * fStack_298;
    auVar49._12_4_ = fVar240 * fStack_294;
    auVar49._16_4_ = fVar241 * fStack_290;
    auVar49._20_4_ = fVar242 * fStack_28c;
    auVar49._24_4_ = fVar102 * fStack_288;
    auVar49._28_4_ = fVar220;
    auVar73 = vfnmadd213ps_fma(local_260,auVar133,auVar49);
    auVar50._4_4_ = fVar237 * local_280._4_4_;
    auVar50._0_4_ = fVar235 * local_280._0_4_;
    auVar50._8_4_ = fVar239 * local_280._8_4_;
    auVar50._12_4_ = fVar240 * local_280._12_4_;
    auVar50._16_4_ = fVar241 * local_280._16_4_;
    auVar50._20_4_ = fVar242 * local_280._20_4_;
    auVar50._24_4_ = fVar102 * local_280._24_4_;
    auVar50._28_4_ = fVar220;
    auVar72 = vfnmadd213ps_fma(auVar30,auVar133,auVar50);
    auVar51._4_4_ = fVar237 * auVar29._4_4_;
    auVar51._0_4_ = fVar235 * auVar29._0_4_;
    auVar51._8_4_ = fVar239 * auVar29._8_4_;
    auVar51._12_4_ = fVar240 * auVar29._12_4_;
    auVar51._16_4_ = fVar241 * auVar29._16_4_;
    auVar51._20_4_ = fVar242 * auVar29._20_4_;
    auVar51._24_4_ = fVar102 * auVar29._24_4_;
    auVar51._28_4_ = auVar25._28_4_ + auVar96._28_4_;
    auVar106 = vfnmadd231ps_fma(auVar51,auVar133,auVar28);
    auVar96 = vminps_avx(ZEXT1632(auVar107),ZEXT1632(auVar19));
    auVar25 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar19));
    auVar24 = vminps_avx(ZEXT1632(auVar114),ZEXT1632(auVar289));
    auVar24 = vminps_avx(auVar96,auVar24);
    auVar96 = vmaxps_avx(ZEXT1632(auVar114),ZEXT1632(auVar289));
    auVar25 = vmaxps_avx(auVar25,auVar96);
    auVar16 = vminps_avx(ZEXT1632(auVar105),ZEXT1632(auVar73));
    auVar96 = vmaxps_avx(ZEXT1632(auVar105),ZEXT1632(auVar73));
    auVar26 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar106));
    auVar16 = vminps_avx(auVar16,auVar26);
    auVar16 = vminps_avx(auVar24,auVar16);
    auVar24 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar106));
    auVar96 = vmaxps_avx(auVar96,auVar24);
    auVar96 = vmaxps_avx(auVar25,auVar96);
    auVar25 = vcmpps_avx(auVar16,auVar55,2);
    auVar96 = vcmpps_avx(auVar96,auVar54,5);
    auVar25 = vandps_avx(auVar96,auVar25);
    auVar95 = vandps_avx(auVar95,local_300);
    auVar96 = auVar95 & auVar25;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar96 >> 0x7f,0) != '\0') ||
          (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar96 >> 0xbf,0) != '\0') ||
        (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar96[0x1f] < '\0')
    {
      auVar95 = vandps_avx(auVar25,auVar95);
      uVar67 = vmovmskps_avx(auVar95);
      if (uVar67 != 0) {
        auStack_4b0[uVar61] = uVar67 & 0xff;
        uVar104 = vmovlps_avx(local_420);
        *(undefined8 *)(&uStack_380 + uVar61 * 2) = uVar104;
        uVar66 = vmovlps_avx(auVar82);
        auStack_1a0[uVar61] = uVar66;
        uVar61 = (ulong)((int)uVar61 + 1);
      }
    }
  }
LAB_0123f8ae:
  if ((int)uVar61 == 0) {
    uVar69 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar94._4_4_ = uVar69;
    auVar94._0_4_ = uVar69;
    auVar94._8_4_ = uVar69;
    auVar94._12_4_ = uVar69;
    auVar15 = vcmpps_avx(local_470,auVar94,2);
    uVar59 = vmovmskps_avx(auVar15);
    uVar60 = (ulong)((uint)uVar60 & (uint)uVar60 + 0xf & uVar59);
    goto LAB_0123e5de;
  }
  uVar58 = (int)uVar61 - 1;
  uVar62 = (ulong)uVar58;
  uVar64 = auStack_4b0[uVar62];
  uVar67 = (&uStack_380)[uVar62 * 2];
  fVar103 = afStack_37c[uVar62 * 2];
  iVar57 = 0;
  for (uVar66 = (ulong)uVar64; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    iVar57 = iVar57 + 1;
  }
  uVar64 = uVar64 - 1 & uVar64;
  if (uVar64 == 0) {
    uVar61 = (ulong)uVar58;
  }
  auVar82._8_8_ = 0;
  auVar82._0_8_ = auStack_1a0[uVar62];
  auStack_4b0[uVar62] = uVar64;
  fVar100 = (float)(iVar57 + 1) * 0.14285715;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * (float)iVar57 * 0.14285715)),ZEXT416(uVar67),
                            ZEXT416((uint)(1.0 - (float)iVar57 * 0.14285715)));
  auVar114 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * fVar100)),ZEXT416(uVar67),
                             ZEXT416((uint)(1.0 - fVar100)));
  fVar100 = auVar114._0_4_;
  auVar233._0_4_ = auVar19._0_4_;
  fVar103 = fVar100 - auVar233._0_4_;
  if (fVar103 < 0.16666667) {
    auVar73 = vshufps_avx(auVar82,auVar82,0x50);
    auVar121._8_4_ = 0x3f800000;
    auVar121._0_8_ = 0x3f8000003f800000;
    auVar121._12_4_ = 0x3f800000;
    auVar72 = vsubps_avx(auVar121,auVar73);
    fVar71 = auVar73._0_4_;
    auVar179._0_4_ = fVar71 * fVar169;
    fVar101 = auVar73._4_4_;
    auVar179._4_4_ = fVar101 * fVar184;
    fVar147 = auVar73._8_4_;
    auVar179._8_4_ = fVar147 * fVar169;
    fVar146 = auVar73._12_4_;
    auVar179._12_4_ = fVar146 * fVar184;
    auVar191._0_4_ = fVar71 * fVar201;
    auVar191._4_4_ = fVar101 * fVar234;
    auVar191._8_4_ = fVar147 * fVar201;
    auVar191._12_4_ = fVar146 * fVar234;
    auVar215._0_4_ = fVar71 * fVar236;
    auVar215._4_4_ = fVar101 * fVar238;
    auVar215._8_4_ = fVar147 * fVar236;
    auVar215._12_4_ = fVar146 * fVar238;
    auVar84._0_4_ = fVar71 * fVar185;
    auVar84._4_4_ = fVar101 * fVar200;
    auVar84._8_4_ = fVar147 * fVar185;
    auVar84._12_4_ = fVar146 * fVar200;
    auVar73 = vfmadd231ps_fma(auVar179,auVar72,auVar246);
    auVar107 = vfmadd231ps_fma(auVar191,auVar72,auVar270);
    auVar289 = vfmadd231ps_fma(auVar215,auVar72,auVar308);
    auVar72 = vfmadd231ps_fma(auVar84,auVar72,auVar317);
    auVar166._16_16_ = auVar73;
    auVar166._0_16_ = auVar73;
    auVar183._16_16_ = auVar107;
    auVar183._0_16_ = auVar107;
    auVar199._16_16_ = auVar289;
    auVar199._0_16_ = auVar289;
    auVar233._4_4_ = auVar233._0_4_;
    auVar233._8_4_ = auVar233._0_4_;
    auVar233._12_4_ = auVar233._0_4_;
    auVar233._20_4_ = fVar100;
    auVar233._16_4_ = fVar100;
    auVar233._24_4_ = fVar100;
    auVar233._28_4_ = fVar100;
    auVar95 = vsubps_avx(auVar183,auVar166);
    auVar107 = vfmadd213ps_fma(auVar95,auVar233,auVar166);
    auVar95 = vsubps_avx(auVar199,auVar183);
    auVar105 = vfmadd213ps_fma(auVar95,auVar233,auVar183);
    auVar73 = vsubps_avx(auVar72,auVar289);
    auVar98._16_16_ = auVar73;
    auVar98._0_16_ = auVar73;
    auVar73 = vfmadd213ps_fma(auVar98,auVar233,auVar199);
    auVar95 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar107));
    auVar72 = vfmadd213ps_fma(auVar95,auVar233,ZEXT1632(auVar107));
    auVar95 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar105));
    auVar73 = vfmadd213ps_fma(auVar95,auVar233,ZEXT1632(auVar105));
    auVar95 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar72));
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar95,auVar233);
    fVar71 = fVar103 * 0.33333334;
    auVar227._0_8_ =
         CONCAT44(auVar148._4_4_ + fVar71 * auVar95._4_4_ * 3.0,
                  auVar148._0_4_ + fVar71 * auVar95._0_4_ * 3.0);
    auVar227._8_4_ = auVar148._8_4_ + fVar71 * auVar95._8_4_ * 3.0;
    auVar227._12_4_ = auVar148._12_4_ + fVar71 * auVar95._12_4_ * 3.0;
    auVar72 = vshufpd_avx(auVar148,auVar148,3);
    auVar107 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar73 = vsubps_avx(auVar72,auVar148);
    auVar289 = vsubps_avx(auVar107,(undefined1  [16])0x0);
    auVar85._0_4_ = auVar73._0_4_ + auVar289._0_4_;
    auVar85._4_4_ = auVar73._4_4_ + auVar289._4_4_;
    auVar85._8_4_ = auVar73._8_4_ + auVar289._8_4_;
    auVar85._12_4_ = auVar73._12_4_ + auVar289._12_4_;
    auVar73 = vshufps_avx(auVar148,auVar148,0xb1);
    auVar289 = vshufps_avx(auVar227,auVar227,0xb1);
    auVar318._4_4_ = auVar85._0_4_;
    auVar318._0_4_ = auVar85._0_4_;
    auVar318._8_4_ = auVar85._0_4_;
    auVar318._12_4_ = auVar85._0_4_;
    auVar105 = vshufps_avx(auVar85,auVar85,0x55);
    fVar101 = auVar105._0_4_;
    auVar86._0_4_ = fVar101 * auVar73._0_4_;
    fVar147 = auVar105._4_4_;
    auVar86._4_4_ = fVar147 * auVar73._4_4_;
    fVar146 = auVar105._8_4_;
    auVar86._8_4_ = fVar146 * auVar73._8_4_;
    fVar167 = auVar105._12_4_;
    auVar86._12_4_ = fVar167 * auVar73._12_4_;
    auVar192._0_4_ = fVar101 * auVar289._0_4_;
    auVar192._4_4_ = fVar147 * auVar289._4_4_;
    auVar192._8_4_ = fVar146 * auVar289._8_4_;
    auVar192._12_4_ = fVar167 * auVar289._12_4_;
    auVar106 = vfmadd231ps_fma(auVar86,auVar318,auVar148);
    auVar281 = vfmadd231ps_fma(auVar192,auVar318,auVar227);
    auVar289 = vshufps_avx(auVar106,auVar106,0xe8);
    auVar105 = vshufps_avx(auVar281,auVar281,0xe8);
    auVar73 = vcmpps_avx(auVar289,auVar105,1);
    uVar67 = vextractps_avx(auVar73,0);
    auVar149 = auVar281;
    if ((uVar67 & 1) == 0) {
      auVar149 = auVar106;
    }
    auVar157._0_4_ = fVar71 * auVar95._16_4_ * 3.0;
    auVar157._4_4_ = fVar71 * auVar95._20_4_ * 3.0;
    auVar157._8_4_ = fVar71 * auVar95._24_4_ * 3.0;
    auVar157._12_4_ = fVar71 * 0.0;
    auVar202 = vsubps_avx((undefined1  [16])0x0,auVar157);
    auVar158 = vshufps_avx(auVar202,auVar202,0xb1);
    auVar170 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar228._0_4_ = fVar101 * auVar158._0_4_;
    auVar228._4_4_ = fVar147 * auVar158._4_4_;
    auVar228._8_4_ = fVar146 * auVar158._8_4_;
    auVar228._12_4_ = fVar167 * auVar158._12_4_;
    auVar247._0_4_ = auVar170._0_4_ * fVar101;
    auVar247._4_4_ = auVar170._4_4_ * fVar147;
    auVar247._8_4_ = auVar170._8_4_ * fVar146;
    auVar247._12_4_ = auVar170._12_4_ * fVar167;
    auVar203 = vfmadd231ps_fma(auVar228,auVar318,auVar202);
    auVar221 = vfmadd231ps_fma(auVar247,(undefined1  [16])0x0,auVar318);
    auVar170 = vshufps_avx(auVar203,auVar203,0xe8);
    auVar186 = vshufps_avx(auVar221,auVar221,0xe8);
    auVar158 = vcmpps_avx(auVar170,auVar186,1);
    uVar67 = vextractps_avx(auVar158,0);
    auVar243 = auVar221;
    if ((uVar67 & 1) == 0) {
      auVar243 = auVar203;
    }
    auVar149 = vmaxss_avx(auVar243,auVar149);
    auVar289 = vminps_avx(auVar289,auVar105);
    auVar105 = vminps_avx(auVar170,auVar186);
    auVar105 = vminps_avx(auVar289,auVar105);
    auVar73 = vshufps_avx(auVar73,auVar73,0x55);
    auVar73 = vblendps_avx(auVar73,auVar158,2);
    auVar158 = vpslld_avx(auVar73,0x1f);
    auVar73 = vshufpd_avx(auVar281,auVar281,1);
    auVar73 = vinsertps_avx(auVar73,auVar221,0x9c);
    auVar289 = vshufpd_avx(auVar106,auVar106,1);
    auVar289 = vinsertps_avx(auVar289,auVar203,0x9c);
    auVar73 = vblendvps_avx(auVar289,auVar73,auVar158);
    auVar289 = vmovshdup_avx(auVar73);
    auVar73 = vmaxss_avx(auVar289,auVar73);
    fVar146 = auVar105._0_4_;
    auVar289 = vmovshdup_avx(auVar105);
    fVar147 = auVar73._0_4_;
    fVar71 = auVar289._0_4_;
    fVar101 = auVar149._0_4_;
    if (((0.0001 <= fVar146) || (fVar147 <= -0.0001)) && (0.0001 <= fVar71 || fVar147 <= -0.0001))
    goto code_r0x0123fbb9;
    goto LAB_0123fbdf;
  }
  local_420 = vinsertps_avx(auVar19,auVar114,0x10);
  goto LAB_0123f2fd;
code_r0x0123fbb9:
  auVar289 = vcmpps_avx(auVar289,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar106 = vcmpps_avx(auVar105,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar289 = vandps_avx(auVar106,auVar289);
  if (fVar101 <= -0.0001 || (auVar289 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0123f8ae;
LAB_0123fbdf:
  auVar106 = vcmpps_avx(auVar105,_DAT_01f45a50,1);
  auVar281 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar289 = vcmpss_avx(auVar149,ZEXT816(0) << 0x20,1);
  auVar122._8_4_ = 0x3f800000;
  auVar122._0_8_ = 0x3f8000003f800000;
  auVar122._12_4_ = 0x3f800000;
  auVar140._8_4_ = 0xbf800000;
  auVar140._0_8_ = 0xbf800000bf800000;
  auVar140._12_4_ = 0xbf800000;
  auVar289 = vblendvps_avx(auVar122,auVar140,auVar289);
  auVar106 = vblendvps_avx(auVar122,auVar140,auVar106);
  fVar168 = auVar106._0_4_;
  fVar167 = auVar289._0_4_;
  auVar289 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar168 == fVar167) && (!NAN(fVar168) && !NAN(fVar167))) {
    auVar289 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar168 == fVar167) && (!NAN(fVar168) && !NAN(fVar167))) {
    auVar281 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar106 = vmovshdup_avx(auVar106);
  fVar220 = auVar106._0_4_;
  if ((fVar168 != fVar220) || (NAN(fVar168) || NAN(fVar220))) {
    if ((fVar71 != fVar146) || (NAN(fVar71) || NAN(fVar146))) {
      auVar159._0_4_ = (float)((uint)fVar146 ^ local_4d0);
      auVar159._4_4_ = auVar105._4_4_ ^ uStack_4cc;
      auVar159._8_4_ = auVar105._8_4_ ^ uStack_4c8;
      auVar159._12_4_ = auVar105._12_4_ ^ uStack_4c4;
      auVar160._0_4_ = auVar159._0_4_ / (fVar71 - fVar146);
      auVar160._4_12_ = auVar159._4_12_;
      auVar105 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar160._0_4_)),auVar160,ZEXT416(0));
      auVar106 = auVar105;
    }
    else {
      auVar105 = ZEXT816(0) << 0x20;
      if ((fVar146 != 0.0) || (auVar106 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar146))) {
        auVar105 = SUB6416(ZEXT464(0x7f800000),0);
        auVar106 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar289 = vminss_avx(auVar289,auVar105);
    auVar281 = vmaxss_avx(auVar106,auVar281);
  }
  auVar73 = vcmpss_avx(auVar73,ZEXT416(0),1);
  auVar123._8_4_ = 0x3f800000;
  auVar123._0_8_ = 0x3f8000003f800000;
  auVar123._12_4_ = 0x3f800000;
  auVar141._8_4_ = 0xbf800000;
  auVar141._0_8_ = 0xbf800000bf800000;
  auVar141._12_4_ = 0xbf800000;
  auVar73 = vblendvps_avx(auVar123,auVar141,auVar73);
  fVar71 = auVar73._0_4_;
  if ((fVar167 != fVar71) || (NAN(fVar167) || NAN(fVar71))) {
    if ((fVar147 != fVar101) || (NAN(fVar147) || NAN(fVar101))) {
      auVar87._0_4_ = (float)((uint)fVar101 ^ local_4d0);
      auVar87._4_4_ = auVar149._4_4_ ^ uStack_4cc;
      auVar87._8_4_ = auVar149._8_4_ ^ uStack_4c8;
      auVar87._12_4_ = auVar149._12_4_ ^ uStack_4c4;
      auVar161._0_4_ = auVar87._0_4_ / (fVar147 - fVar101);
      auVar161._4_12_ = auVar87._4_12_;
      auVar73 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar161._0_4_)),auVar161,ZEXT416(0));
      auVar105 = auVar73;
    }
    else {
      auVar73 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar101 != 0.0) || (auVar105 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar101))) {
        auVar73 = SUB6416(ZEXT464(0xff800000),0);
        auVar105 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar289 = vminss_avx(auVar289,auVar105);
    auVar281 = vmaxss_avx(auVar73,auVar281);
  }
  if ((fVar220 != fVar71) || (NAN(fVar220) || NAN(fVar71))) {
    auVar289 = vminss_avx(auVar289,SUB6416(ZEXT464(0x3f800000),0));
    auVar281 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar281);
  }
  auVar73 = vmaxss_avx(ZEXT816(0) << 0x40,auVar289);
  auVar289 = vminss_avx(auVar281,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar289._0_4_ < auVar73._0_4_) goto LAB_0123f8ae;
  auVar73 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar73._0_4_ + -0.1)));
  auVar289 = vminss_avx(ZEXT416((uint)(auVar289._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar180._0_8_ = auVar148._0_8_;
  auVar180._8_8_ = auVar180._0_8_;
  auVar259._8_8_ = auVar227._0_8_;
  auVar259._0_8_ = auVar227._0_8_;
  auVar271._8_8_ = auVar202._0_8_;
  auVar271._0_8_ = auVar202._0_8_;
  auVar105 = vshufpd_avx(auVar227,auVar227,3);
  auVar106 = vshufpd_avx(auVar202,auVar202,3);
  auVar281 = vshufps_avx(auVar73,auVar289,0);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar148 = vsubps_avx(auVar88,auVar281);
  local_600 = auVar72._0_4_;
  fStack_5fc = auVar72._4_4_;
  fStack_5f8 = auVar72._8_4_;
  fStack_5f4 = auVar72._12_4_;
  fVar71 = auVar281._0_4_;
  auVar89._0_4_ = fVar71 * local_600;
  fVar101 = auVar281._4_4_;
  auVar89._4_4_ = fVar101 * fStack_5fc;
  fVar147 = auVar281._8_4_;
  auVar89._8_4_ = fVar147 * fStack_5f8;
  fVar146 = auVar281._12_4_;
  auVar89._12_4_ = fVar146 * fStack_5f4;
  auVar216._0_4_ = fVar71 * auVar105._0_4_;
  auVar216._4_4_ = fVar101 * auVar105._4_4_;
  auVar216._8_4_ = fVar147 * auVar105._8_4_;
  auVar216._12_4_ = fVar146 * auVar105._12_4_;
  auVar229._0_4_ = fVar71 * auVar106._0_4_;
  auVar229._4_4_ = fVar101 * auVar106._4_4_;
  auVar229._8_4_ = fVar147 * auVar106._8_4_;
  auVar229._12_4_ = fVar146 * auVar106._12_4_;
  local_660 = auVar107._0_4_;
  fStack_65c = auVar107._4_4_;
  fStack_658 = auVar107._8_4_;
  fStack_654 = auVar107._12_4_;
  auVar248._0_4_ = fVar71 * local_660;
  auVar248._4_4_ = fVar101 * fStack_65c;
  auVar248._8_4_ = fVar147 * fStack_658;
  auVar248._12_4_ = fVar146 * fStack_654;
  auVar105 = vfmadd231ps_fma(auVar89,auVar148,auVar180);
  auVar106 = vfmadd231ps_fma(auVar216,auVar148,auVar259);
  auVar281 = vfmadd231ps_fma(auVar229,auVar148,auVar271);
  auVar148 = vfmadd231ps_fma(auVar248,auVar148,ZEXT816(0));
  auVar72 = vmovshdup_avx(auVar82);
  auVar202 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar73._0_4_)),auVar82,
                             ZEXT416((uint)(1.0 - auVar73._0_4_)));
  auVar203 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar289._0_4_)),auVar82,
                             ZEXT416((uint)(1.0 - auVar289._0_4_)));
  fVar71 = 1.0 / fVar103;
  auVar73 = vsubps_avx(auVar106,auVar105);
  auVar260._0_4_ = auVar73._0_4_ * 3.0;
  auVar260._4_4_ = auVar73._4_4_ * 3.0;
  auVar260._8_4_ = auVar73._8_4_ * 3.0;
  auVar260._12_4_ = auVar73._12_4_ * 3.0;
  auVar73 = vsubps_avx(auVar281,auVar106);
  auVar272._0_4_ = auVar73._0_4_ * 3.0;
  auVar272._4_4_ = auVar73._4_4_ * 3.0;
  auVar272._8_4_ = auVar73._8_4_ * 3.0;
  auVar272._12_4_ = auVar73._12_4_ * 3.0;
  auVar73 = vsubps_avx(auVar148,auVar281);
  auVar282._0_4_ = auVar73._0_4_ * 3.0;
  auVar282._4_4_ = auVar73._4_4_ * 3.0;
  auVar282._8_4_ = auVar73._8_4_ * 3.0;
  auVar282._12_4_ = auVar73._12_4_ * 3.0;
  auVar72 = vminps_avx(auVar272,auVar282);
  auVar73 = vmaxps_avx(auVar272,auVar282);
  auVar72 = vminps_avx(auVar260,auVar72);
  auVar73 = vmaxps_avx(auVar260,auVar73);
  auVar107 = vshufpd_avx(auVar72,auVar72,3);
  auVar289 = vshufpd_avx(auVar73,auVar73,3);
  auVar72 = vminps_avx(auVar72,auVar107);
  auVar73 = vmaxps_avx(auVar73,auVar289);
  auVar273._0_4_ = auVar72._0_4_ * fVar71;
  auVar273._4_4_ = auVar72._4_4_ * fVar71;
  auVar273._8_4_ = auVar72._8_4_ * fVar71;
  auVar273._12_4_ = auVar72._12_4_ * fVar71;
  auVar261._0_4_ = auVar73._0_4_ * fVar71;
  auVar261._4_4_ = auVar73._4_4_ * fVar71;
  auVar261._8_4_ = auVar73._8_4_ * fVar71;
  auVar261._12_4_ = auVar73._12_4_ * fVar71;
  fVar71 = 1.0 / (auVar203._0_4_ - auVar202._0_4_);
  auVar73 = vshufpd_avx(auVar105,auVar105,3);
  auVar72 = vshufpd_avx(auVar106,auVar106,3);
  auVar107 = vshufpd_avx(auVar281,auVar281,3);
  auVar289 = vshufpd_avx(auVar148,auVar148,3);
  auVar73 = vsubps_avx(auVar73,auVar105);
  auVar105 = vsubps_avx(auVar72,auVar106);
  auVar106 = vsubps_avx(auVar107,auVar281);
  auVar289 = vsubps_avx(auVar289,auVar148);
  auVar72 = vminps_avx(auVar73,auVar105);
  auVar73 = vmaxps_avx(auVar73,auVar105);
  auVar107 = vminps_avx(auVar106,auVar289);
  auVar107 = vminps_avx(auVar72,auVar107);
  auVar72 = vmaxps_avx(auVar106,auVar289);
  auVar73 = vmaxps_avx(auVar73,auVar72);
  auVar309._0_4_ = fVar71 * auVar107._0_4_;
  auVar309._4_4_ = fVar71 * auVar107._4_4_;
  auVar309._8_4_ = fVar71 * auVar107._8_4_;
  auVar309._12_4_ = fVar71 * auVar107._12_4_;
  auVar290._0_4_ = fVar71 * auVar73._0_4_;
  auVar290._4_4_ = fVar71 * auVar73._4_4_;
  auVar290._8_4_ = fVar71 * auVar73._8_4_;
  auVar290._12_4_ = fVar71 * auVar73._12_4_;
  auVar289 = vinsertps_avx(auVar19,auVar202,0x10);
  auVar105 = vinsertps_avx(auVar114,auVar203,0x10);
  auVar283._0_4_ = (auVar289._0_4_ + auVar105._0_4_) * 0.5;
  auVar283._4_4_ = (auVar289._4_4_ + auVar105._4_4_) * 0.5;
  auVar283._8_4_ = (auVar289._8_4_ + auVar105._8_4_) * 0.5;
  auVar283._12_4_ = (auVar289._12_4_ + auVar105._12_4_) * 0.5;
  auVar90._4_4_ = auVar283._0_4_;
  auVar90._0_4_ = auVar283._0_4_;
  auVar90._8_4_ = auVar283._0_4_;
  auVar90._12_4_ = auVar283._0_4_;
  auVar73 = vfmadd213ps_fma(auVar15,auVar90,auVar21);
  auVar72 = vfmadd213ps_fma(auVar18,auVar90,auVar174);
  auVar107 = vfmadd213ps_fma(local_390,auVar90,auVar22);
  auVar114 = vsubps_avx(auVar72,auVar73);
  auVar73 = vfmadd213ps_fma(auVar114,auVar90,auVar73);
  auVar114 = vsubps_avx(auVar107,auVar72);
  auVar114 = vfmadd213ps_fma(auVar114,auVar90,auVar72);
  auVar114 = vsubps_avx(auVar114,auVar73);
  auVar73 = vfmadd231ps_fma(auVar73,auVar114,auVar90);
  auVar91._0_8_ = CONCAT44(auVar114._4_4_ * 3.0,auVar114._0_4_ * 3.0);
  auVar91._8_4_ = auVar114._8_4_ * 3.0;
  auVar91._12_4_ = auVar114._12_4_ * 3.0;
  auVar319._8_8_ = auVar73._0_8_;
  auVar319._0_8_ = auVar73._0_8_;
  auVar114 = vshufpd_avx(auVar73,auVar73,3);
  auVar73 = vshufps_avx(auVar283,auVar283,0x55);
  auVar281 = vsubps_avx(auVar114,auVar319);
  auVar149 = vfmadd231ps_fma(auVar319,auVar73,auVar281);
  auVar327._8_8_ = auVar91._0_8_;
  auVar327._0_8_ = auVar91._0_8_;
  auVar114 = vshufpd_avx(auVar91,auVar91,3);
  auVar114 = vsubps_avx(auVar114,auVar327);
  auVar148 = vfmadd213ps_fma(auVar114,auVar73,auVar327);
  auVar73 = vmovshdup_avx(auVar148);
  auVar328._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
  auVar328._8_4_ = auVar73._8_4_ ^ 0x80000000;
  auVar328._12_4_ = auVar73._12_4_ ^ 0x80000000;
  auVar72 = vmovshdup_avx(auVar281);
  auVar114 = vunpcklps_avx(auVar72,auVar328);
  auVar107 = vshufps_avx(auVar114,auVar328,4);
  auVar106 = vshufps_avx(auVar283,auVar283,0x54);
  auVar162._0_8_ = auVar281._0_8_ ^ 0x8000000080000000;
  auVar162._8_4_ = auVar281._8_4_ ^ 0x80000000;
  auVar162._12_4_ = auVar281._12_4_ ^ 0x80000000;
  auVar114 = vmovlhps_avx(auVar162,auVar148);
  auVar114 = vshufps_avx(auVar114,auVar148,8);
  auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar281._0_4_ * auVar73._0_4_)),auVar72,auVar148);
  uVar69 = auVar73._0_4_;
  auVar92._4_4_ = uVar69;
  auVar92._0_4_ = uVar69;
  auVar92._8_4_ = uVar69;
  auVar92._12_4_ = uVar69;
  auVar73 = vdivps_avx(auVar107,auVar92);
  auVar72 = vdivps_avx(auVar114,auVar92);
  fVar147 = auVar149._0_4_;
  fVar71 = auVar73._0_4_;
  auVar114 = vshufps_avx(auVar149,auVar149,0x55);
  fVar101 = auVar72._0_4_;
  auVar93._0_4_ = fVar147 * fVar71 + auVar114._0_4_ * fVar101;
  auVar93._4_4_ = fVar147 * auVar73._4_4_ + auVar114._4_4_ * auVar72._4_4_;
  auVar93._8_4_ = fVar147 * auVar73._8_4_ + auVar114._8_4_ * auVar72._8_4_;
  auVar93._12_4_ = fVar147 * auVar73._12_4_ + auVar114._12_4_ * auVar72._12_4_;
  auVar186 = vsubps_avx(auVar106,auVar93);
  auVar106 = vmovshdup_avx(auVar73);
  auVar114 = vinsertps_avx(auVar273,auVar309,0x1c);
  auVar193._0_4_ = auVar106._0_4_ * auVar114._0_4_;
  auVar193._4_4_ = auVar106._4_4_ * auVar114._4_4_;
  auVar193._8_4_ = auVar106._8_4_ * auVar114._8_4_;
  auVar193._12_4_ = auVar106._12_4_ * auVar114._12_4_;
  auVar107 = vinsertps_avx(auVar261,auVar290,0x1c);
  auVar124._0_4_ = auVar107._0_4_ * auVar106._0_4_;
  auVar124._4_4_ = auVar107._4_4_ * auVar106._4_4_;
  auVar124._8_4_ = auVar107._8_4_ * auVar106._8_4_;
  auVar124._12_4_ = auVar107._12_4_ * auVar106._12_4_;
  auVar149 = vminps_avx(auVar193,auVar124);
  auVar148 = vmaxps_avx(auVar124,auVar193);
  auVar106 = vinsertps_avx(auVar309,auVar273,0x4c);
  auVar158 = vmovshdup_avx(auVar72);
  auVar281 = vinsertps_avx(auVar290,auVar261,0x4c);
  auVar291._0_4_ = auVar158._0_4_ * auVar106._0_4_;
  auVar291._4_4_ = auVar158._4_4_ * auVar106._4_4_;
  auVar291._8_4_ = auVar158._8_4_ * auVar106._8_4_;
  auVar291._12_4_ = auVar158._12_4_ * auVar106._12_4_;
  auVar274._0_4_ = auVar158._0_4_ * auVar281._0_4_;
  auVar274._4_4_ = auVar158._4_4_ * auVar281._4_4_;
  auVar274._8_4_ = auVar158._8_4_ * auVar281._8_4_;
  auVar274._12_4_ = auVar158._12_4_ * auVar281._12_4_;
  auVar158 = vminps_avx(auVar291,auVar274);
  auVar310._0_4_ = auVar149._0_4_ + auVar158._0_4_;
  auVar310._4_4_ = auVar149._4_4_ + auVar158._4_4_;
  auVar310._8_4_ = auVar149._8_4_ + auVar158._8_4_;
  auVar310._12_4_ = auVar149._12_4_ + auVar158._12_4_;
  auVar149 = vmaxps_avx(auVar274,auVar291);
  auVar125._0_4_ = auVar149._0_4_ + auVar148._0_4_;
  auVar125._4_4_ = auVar149._4_4_ + auVar148._4_4_;
  auVar125._8_4_ = auVar149._8_4_ + auVar148._8_4_;
  auVar125._12_4_ = auVar149._12_4_ + auVar148._12_4_;
  auVar275._8_8_ = 0x3f80000000000000;
  auVar275._0_8_ = 0x3f80000000000000;
  auVar148 = vsubps_avx(auVar275,auVar125);
  auVar149 = vsubps_avx(auVar275,auVar310);
  auVar158 = vsubps_avx(auVar289,auVar283);
  auVar170 = vsubps_avx(auVar105,auVar283);
  auVar142._0_4_ = fVar71 * auVar114._0_4_;
  auVar142._4_4_ = fVar71 * auVar114._4_4_;
  auVar142._8_4_ = fVar71 * auVar114._8_4_;
  auVar142._12_4_ = fVar71 * auVar114._12_4_;
  auVar311._0_4_ = fVar71 * auVar107._0_4_;
  auVar311._4_4_ = fVar71 * auVar107._4_4_;
  auVar311._8_4_ = fVar71 * auVar107._8_4_;
  auVar311._12_4_ = fVar71 * auVar107._12_4_;
  auVar107 = vminps_avx(auVar142,auVar311);
  auVar114 = vmaxps_avx(auVar311,auVar142);
  auVar194._0_4_ = fVar101 * auVar106._0_4_;
  auVar194._4_4_ = fVar101 * auVar106._4_4_;
  auVar194._8_4_ = fVar101 * auVar106._8_4_;
  auVar194._12_4_ = fVar101 * auVar106._12_4_;
  auVar262._0_4_ = fVar101 * auVar281._0_4_;
  auVar262._4_4_ = fVar101 * auVar281._4_4_;
  auVar262._8_4_ = fVar101 * auVar281._8_4_;
  auVar262._12_4_ = fVar101 * auVar281._12_4_;
  auVar106 = vminps_avx(auVar194,auVar262);
  auVar312._0_4_ = auVar107._0_4_ + auVar106._0_4_;
  auVar312._4_4_ = auVar107._4_4_ + auVar106._4_4_;
  auVar312._8_4_ = auVar107._8_4_ + auVar106._8_4_;
  auVar312._12_4_ = auVar107._12_4_ + auVar106._12_4_;
  fVar220 = auVar158._0_4_;
  auVar320._0_4_ = fVar220 * auVar148._0_4_;
  fVar235 = auVar158._4_4_;
  auVar320._4_4_ = fVar235 * auVar148._4_4_;
  fVar237 = auVar158._8_4_;
  auVar320._8_4_ = fVar237 * auVar148._8_4_;
  fVar239 = auVar158._12_4_;
  auVar320._12_4_ = fVar239 * auVar148._12_4_;
  auVar107 = vmaxps_avx(auVar262,auVar194);
  auVar263._0_4_ = fVar220 * auVar149._0_4_;
  auVar263._4_4_ = fVar235 * auVar149._4_4_;
  auVar263._8_4_ = fVar237 * auVar149._8_4_;
  auVar263._12_4_ = fVar239 * auVar149._12_4_;
  fVar147 = auVar170._0_4_;
  auVar126._0_4_ = fVar147 * auVar148._0_4_;
  fVar146 = auVar170._4_4_;
  auVar126._4_4_ = fVar146 * auVar148._4_4_;
  fVar167 = auVar170._8_4_;
  auVar126._8_4_ = fVar167 * auVar148._8_4_;
  fVar168 = auVar170._12_4_;
  auVar126._12_4_ = fVar168 * auVar148._12_4_;
  auVar276._0_4_ = fVar147 * auVar149._0_4_;
  auVar276._4_4_ = fVar146 * auVar149._4_4_;
  auVar276._8_4_ = fVar167 * auVar149._8_4_;
  auVar276._12_4_ = fVar168 * auVar149._12_4_;
  auVar143._0_4_ = auVar114._0_4_ + auVar107._0_4_;
  auVar143._4_4_ = auVar114._4_4_ + auVar107._4_4_;
  auVar143._8_4_ = auVar114._8_4_ + auVar107._8_4_;
  auVar143._12_4_ = auVar114._12_4_ + auVar107._12_4_;
  auVar195._8_8_ = 0x3f800000;
  auVar195._0_8_ = 0x3f800000;
  auVar114 = vsubps_avx(auVar195,auVar143);
  auVar107 = vsubps_avx(auVar195,auVar312);
  auVar313._0_4_ = fVar220 * auVar114._0_4_;
  auVar313._4_4_ = fVar235 * auVar114._4_4_;
  auVar313._8_4_ = fVar237 * auVar114._8_4_;
  auVar313._12_4_ = fVar239 * auVar114._12_4_;
  auVar292._0_4_ = fVar220 * auVar107._0_4_;
  auVar292._4_4_ = fVar235 * auVar107._4_4_;
  auVar292._8_4_ = fVar237 * auVar107._8_4_;
  auVar292._12_4_ = fVar239 * auVar107._12_4_;
  auVar144._0_4_ = fVar147 * auVar114._0_4_;
  auVar144._4_4_ = fVar146 * auVar114._4_4_;
  auVar144._8_4_ = fVar167 * auVar114._8_4_;
  auVar144._12_4_ = fVar168 * auVar114._12_4_;
  auVar196._0_4_ = fVar147 * auVar107._0_4_;
  auVar196._4_4_ = fVar146 * auVar107._4_4_;
  auVar196._8_4_ = fVar167 * auVar107._8_4_;
  auVar196._12_4_ = fVar168 * auVar107._12_4_;
  auVar114 = vminps_avx(auVar313,auVar292);
  auVar107 = vminps_avx(auVar144,auVar196);
  auVar114 = vminps_avx(auVar114,auVar107);
  auVar107 = vmaxps_avx(auVar292,auVar313);
  auVar106 = vmaxps_avx(auVar196,auVar144);
  auVar281 = vminps_avx(auVar320,auVar263);
  auVar148 = vminps_avx(auVar126,auVar276);
  auVar281 = vminps_avx(auVar281,auVar148);
  auVar114 = vhaddps_avx(auVar114,auVar281);
  auVar107 = vmaxps_avx(auVar106,auVar107);
  auVar106 = vmaxps_avx(auVar263,auVar320);
  auVar281 = vmaxps_avx(auVar276,auVar126);
  auVar106 = vmaxps_avx(auVar281,auVar106);
  auVar107 = vhaddps_avx(auVar107,auVar106);
  auVar114 = vshufps_avx(auVar114,auVar114,0xe8);
  auVar107 = vshufps_avx(auVar107,auVar107,0xe8);
  auVar277._0_4_ = auVar186._0_4_ + auVar114._0_4_;
  auVar277._4_4_ = auVar186._4_4_ + auVar114._4_4_;
  auVar277._8_4_ = auVar186._8_4_ + auVar114._8_4_;
  auVar277._12_4_ = auVar186._12_4_ + auVar114._12_4_;
  auVar264._0_4_ = auVar186._0_4_ + auVar107._0_4_;
  auVar264._4_4_ = auVar186._4_4_ + auVar107._4_4_;
  auVar264._8_4_ = auVar186._8_4_ + auVar107._8_4_;
  auVar264._12_4_ = auVar186._12_4_ + auVar107._12_4_;
  auVar114 = vmaxps_avx(auVar289,auVar277);
  auVar107 = vminps_avx(auVar264,auVar105);
  auVar114 = vcmpps_avx(auVar107,auVar114,1);
  auVar114 = vshufps_avx(auVar114,auVar114,0x50);
  if ((auVar114 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar114[0xf] < '\0')
  goto LAB_0123f8ae;
  bVar63 = 0;
  if ((auVar233._0_4_ < auVar277._0_4_) && (bVar63 = 0, auVar264._0_4_ < auVar105._0_4_)) {
    auVar107 = vmovshdup_avx(auVar277);
    auVar114 = vcmpps_avx(auVar264,auVar105,1);
    bVar63 = auVar114[4] & auVar202._0_4_ < auVar107._0_4_;
  }
  if (((3 < (uint)uVar61 || fVar103 < 0.001) | bVar63) == 1) {
    lVar65 = 0xc9;
    do {
      lVar65 = lVar65 + -1;
      if (lVar65 == 0) goto LAB_0123f8ae;
      fVar146 = auVar186._0_4_;
      fVar147 = 1.0 - fVar146;
      fVar103 = fVar147 * fVar147 * fVar147;
      fVar100 = fVar146 * 3.0 * fVar147 * fVar147;
      fVar147 = fVar147 * fVar146 * fVar146 * 3.0;
      auVar181._4_4_ = fVar103;
      auVar181._0_4_ = fVar103;
      auVar181._8_4_ = fVar103;
      auVar181._12_4_ = fVar103;
      auVar145._4_4_ = fVar100;
      auVar145._0_4_ = fVar100;
      auVar145._8_4_ = fVar100;
      auVar145._12_4_ = fVar100;
      auVar127._4_4_ = fVar147;
      auVar127._0_4_ = fVar147;
      auVar127._8_4_ = fVar147;
      auVar127._12_4_ = fVar147;
      fVar146 = fVar146 * fVar146 * fVar146;
      auVar197._0_4_ = (float)local_3a0._0_4_ * fVar146;
      auVar197._4_4_ = (float)local_3a0._4_4_ * fVar146;
      auVar197._8_4_ = fStack_398 * fVar146;
      auVar197._12_4_ = fStack_394 * fVar146;
      auVar19 = vfmadd231ps_fma(auVar197,auVar22,auVar127);
      auVar19 = vfmadd231ps_fma(auVar19,auVar174,auVar145);
      auVar19 = vfmadd231ps_fma(auVar19,auVar21,auVar181);
      auVar128._8_8_ = auVar19._0_8_;
      auVar128._0_8_ = auVar19._0_8_;
      auVar19 = vshufpd_avx(auVar19,auVar19,3);
      auVar114 = vshufps_avx(auVar186,auVar186,0x55);
      auVar19 = vsubps_avx(auVar19,auVar128);
      auVar114 = vfmadd213ps_fma(auVar19,auVar114,auVar128);
      fVar103 = auVar114._0_4_;
      auVar19 = vshufps_avx(auVar114,auVar114,0x55);
      auVar129._0_4_ = fVar71 * fVar103 + fVar101 * auVar19._0_4_;
      auVar129._4_4_ = auVar73._4_4_ * fVar103 + auVar72._4_4_ * auVar19._4_4_;
      auVar129._8_4_ = auVar73._8_4_ * fVar103 + auVar72._8_4_ * auVar19._8_4_;
      auVar129._12_4_ = auVar73._12_4_ * fVar103 + auVar72._12_4_ * auVar19._12_4_;
      auVar186 = vsubps_avx(auVar186,auVar129);
      auVar19 = vandps_avx(local_4c0,auVar114);
      auVar114 = vshufps_avx(auVar19,auVar19,0xf5);
      auVar19 = vmaxss_avx(auVar114,auVar19);
    } while ((float)local_3b0._0_4_ <= auVar19._0_4_);
    local_120 = auVar186._0_4_;
    if ((0.0 <= local_120) && (local_120 <= 1.0)) {
      auVar19 = vmovshdup_avx(auVar186);
      fVar103 = auVar19._0_4_;
      if ((0.0 <= fVar103) && (fVar103 <= 1.0)) {
        auVar114 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar281 = vinsertps_avx(auVar114,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar114 = vdpps_avx(auVar281,local_4e0,0x7f);
        auVar73 = vdpps_avx(auVar281,local_4f0,0x7f);
        auVar72 = vdpps_avx(auVar281,local_3c0,0x7f);
        auVar107 = vdpps_avx(auVar281,local_3d0,0x7f);
        auVar289 = vdpps_avx(auVar281,local_3e0,0x7f);
        auVar105 = vdpps_avx(auVar281,local_3f0,0x7f);
        auVar106 = vdpps_avx(auVar281,local_400,0x7f);
        auVar281 = vdpps_avx(auVar281,local_410,0x7f);
        fVar100 = 1.0 - fVar103;
        auVar114 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar289._0_4_)),ZEXT416((uint)fVar100),
                                   auVar114);
        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar105._0_4_ * fVar103)),ZEXT416((uint)fVar100),
                                  auVar73);
        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * fVar103)),ZEXT416((uint)fVar100),
                                  auVar72);
        auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar281._0_4_)),ZEXT416((uint)fVar100),
                                   auVar107);
        fVar147 = 1.0 - local_120;
        fVar100 = fVar147 * local_120 * local_120 * 3.0;
        fVar167 = local_120 * local_120 * local_120;
        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * auVar107._0_4_)),ZEXT416((uint)fVar100),
                                  auVar72);
        fVar71 = local_120 * 3.0 * fVar147 * fVar147;
        auVar73 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar71),auVar73);
        fVar101 = fVar147 * fVar147 * fVar147;
        auVar114 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar101),auVar114);
        fVar146 = auVar114._0_4_;
        if (((fVar70 <= fVar146) && (fVar168 = *(float *)(ray + k * 4 + 0x100), fVar146 <= fVar168))
           && (pGVar8 = (context->scene->geometries).items[uVar59].ptr,
              (pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
          auVar114 = vshufps_avx(auVar186,auVar186,0x55);
          auVar265._8_4_ = 0x3f800000;
          auVar265._0_8_ = 0x3f8000003f800000;
          auVar265._12_4_ = 0x3f800000;
          auVar73 = vsubps_avx(auVar265,auVar114);
          fVar220 = auVar114._0_4_;
          auVar278._0_4_ = fVar220 * (float)local_530._0_4_;
          fVar235 = auVar114._4_4_;
          auVar278._4_4_ = fVar235 * (float)local_530._4_4_;
          fVar237 = auVar114._8_4_;
          auVar278._8_4_ = fVar237 * fStack_528;
          fVar239 = auVar114._12_4_;
          auVar278._12_4_ = fVar239 * fStack_524;
          auVar284._0_4_ = fVar220 * (float)local_540._0_4_;
          auVar284._4_4_ = fVar235 * (float)local_540._4_4_;
          auVar284._8_4_ = fVar237 * fStack_538;
          auVar284._12_4_ = fVar239 * fStack_534;
          local_5c0 = auVar20._0_4_;
          fStack_5bc = auVar20._4_4_;
          fStack_5b8 = auVar20._8_4_;
          fStack_5b4 = auVar20._12_4_;
          auVar293._0_4_ = fVar220 * local_5c0;
          auVar293._4_4_ = fVar235 * fStack_5bc;
          auVar293._8_4_ = fVar237 * fStack_5b8;
          auVar293._12_4_ = fVar239 * fStack_5b4;
          local_5d0 = auVar171._0_4_;
          fStack_5cc = auVar171._4_4_;
          fStack_5c8 = auVar171._8_4_;
          fStack_5c4 = auVar171._12_4_;
          auVar249._0_4_ = fVar220 * local_5d0;
          auVar249._4_4_ = fVar235 * fStack_5cc;
          auVar249._8_4_ = fVar237 * fStack_5c8;
          auVar249._12_4_ = fVar239 * fStack_5c4;
          auVar114 = vfmadd231ps_fma(auVar278,auVar73,local_500);
          auVar72 = vfmadd231ps_fma(auVar284,auVar73,auVar17);
          auVar107 = vfmadd231ps_fma(auVar293,auVar73,local_510);
          auVar289 = vfmadd231ps_fma(auVar249,auVar73,local_520);
          auVar114 = vsubps_avx(auVar72,auVar114);
          auVar73 = vsubps_avx(auVar107,auVar72);
          auVar72 = vsubps_avx(auVar289,auVar107);
          auVar294._0_4_ = local_120 * auVar73._0_4_;
          auVar294._4_4_ = local_120 * auVar73._4_4_;
          auVar294._8_4_ = local_120 * auVar73._8_4_;
          auVar294._12_4_ = local_120 * auVar73._12_4_;
          auVar230._4_4_ = fVar147;
          auVar230._0_4_ = fVar147;
          auVar230._8_4_ = fVar147;
          auVar230._12_4_ = fVar147;
          auVar114 = vfmadd231ps_fma(auVar294,auVar230,auVar114);
          auVar250._0_4_ = local_120 * auVar72._0_4_;
          auVar250._4_4_ = local_120 * auVar72._4_4_;
          auVar250._8_4_ = local_120 * auVar72._8_4_;
          auVar250._12_4_ = local_120 * auVar72._12_4_;
          auVar73 = vfmadd231ps_fma(auVar250,auVar230,auVar73);
          auVar251._0_4_ = local_120 * auVar73._0_4_;
          auVar251._4_4_ = local_120 * auVar73._4_4_;
          auVar251._8_4_ = local_120 * auVar73._8_4_;
          auVar251._12_4_ = local_120 * auVar73._12_4_;
          auVar73 = vfmadd231ps_fma(auVar251,auVar230,auVar114);
          auVar217._0_4_ = fVar167 * (float)local_460._0_4_;
          auVar217._4_4_ = fVar167 * (float)local_460._4_4_;
          auVar217._8_4_ = fVar167 * fStack_458;
          auVar217._12_4_ = fVar167 * fStack_454;
          auVar163._4_4_ = fVar100;
          auVar163._0_4_ = fVar100;
          auVar163._8_4_ = fVar100;
          auVar163._12_4_ = fVar100;
          auVar114 = vfmadd132ps_fma(auVar163,auVar217,local_450);
          auVar198._4_4_ = fVar71;
          auVar198._0_4_ = fVar71;
          auVar198._8_4_ = fVar71;
          auVar198._12_4_ = fVar71;
          auVar114 = vfmadd132ps_fma(auVar198,auVar114,local_440);
          auVar218._0_4_ = auVar73._0_4_ * 3.0;
          auVar218._4_4_ = auVar73._4_4_ * 3.0;
          auVar218._8_4_ = auVar73._8_4_ * 3.0;
          auVar218._12_4_ = auVar73._12_4_ * 3.0;
          auVar182._4_4_ = fVar101;
          auVar182._0_4_ = fVar101;
          auVar182._8_4_ = fVar101;
          auVar182._12_4_ = fVar101;
          auVar73 = vfmadd132ps_fma(auVar182,auVar114,local_430);
          auVar114 = vshufps_avx(auVar218,auVar218,0xc9);
          auVar164._0_4_ = auVar73._0_4_ * auVar114._0_4_;
          auVar164._4_4_ = auVar73._4_4_ * auVar114._4_4_;
          auVar164._8_4_ = auVar73._8_4_ * auVar114._8_4_;
          auVar164._12_4_ = auVar73._12_4_ * auVar114._12_4_;
          auVar114 = vshufps_avx(auVar73,auVar73,0xc9);
          auVar114 = vfmsub231ps_fma(auVar164,auVar218,auVar114);
          local_140 = auVar114._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar146;
            uVar69 = vextractps_avx(auVar114,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar69;
            uVar69 = vextractps_avx(auVar114,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar69;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar103;
            *(uint *)(ray + k * 4 + 0x220) = uVar7;
            *(uint *)(ray + k * 4 + 0x240) = uVar59;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_0123f8ae;
          }
          local_100 = auVar19._0_8_;
          auVar19 = vmovshdup_avx(auVar114);
          local_180 = auVar19._0_8_;
          auVar19 = vshufps_avx(auVar114,auVar114,0xaa);
          local_160 = auVar19._0_8_;
          uStack_178 = local_180;
          uStack_170 = local_180;
          uStack_168 = local_180;
          uStack_158 = local_160;
          uStack_150 = local_160;
          uStack_148 = local_160;
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          uStack_f8 = local_100;
          uStack_f0 = local_100;
          uStack_e8 = local_100;
          local_e0 = CONCAT44(uStack_33c,local_340);
          uStack_d8 = CONCAT44(uStack_334,uStack_338);
          uStack_d0 = CONCAT44(uStack_32c,uStack_330);
          uStack_c8 = CONCAT44(uStack_324,uStack_328);
          local_c0._4_4_ = uStack_31c;
          local_c0._0_4_ = local_320;
          local_c0._8_4_ = uStack_318;
          local_c0._12_4_ = uStack_314;
          local_c0._16_4_ = uStack_310;
          local_c0._20_4_ = uStack_30c;
          local_c0._24_4_ = uStack_308;
          local_c0._28_4_ = uStack_304;
          vpcmpeqd_avx2(local_c0,local_c0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar146;
          local_4a0 = local_360;
          local_570.valid = (int *)local_4a0;
          local_570.geometryUserPtr = pGVar8->userPtr;
          local_570.context = context->user;
          local_570.hit = (RTCHitN *)&local_180;
          local_570.N = 8;
          local_570.ray = (RTCRayN *)ray;
          if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar8->intersectionFilterN)(&local_570);
          }
          auVar95 = vpcmpeqd_avx2(local_4a0,_DAT_01f7b000);
          auVar95 = _DAT_01f7b020 & ~auVar95;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var14)(&local_570);
            }
            auVar25 = vpcmpeqd_avx2(local_4a0,_DAT_01f7b000);
            auVar95 = _DAT_01f7b020 & ~auVar25;
            if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar95 >> 0x7f,0) != '\0') ||
                  (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0xbf,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar95[0x1f] < '\0') {
              auVar99._0_8_ = auVar25._0_8_ ^ 0xffffffffffffffff;
              auVar99._8_4_ = auVar25._8_4_ ^ 0xffffffff;
              auVar99._12_4_ = auVar25._12_4_ ^ 0xffffffff;
              auVar99._16_4_ = auVar25._16_4_ ^ 0xffffffff;
              auVar99._20_4_ = auVar25._20_4_ ^ 0xffffffff;
              auVar99._24_4_ = auVar25._24_4_ ^ 0xffffffff;
              auVar99._28_4_ = auVar25._28_4_ ^ 0xffffffff;
              auVar95 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])local_570.hit);
              *(undefined1 (*) [32])(local_570.ray + 0x180) = auVar95;
              auVar95 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_570.hit + 0x20));
              *(undefined1 (*) [32])(local_570.ray + 0x1a0) = auVar95;
              auVar95 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_570.hit + 0x40));
              *(undefined1 (*) [32])(local_570.ray + 0x1c0) = auVar95;
              auVar95 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_570.hit + 0x60));
              *(undefined1 (*) [32])(local_570.ray + 0x1e0) = auVar95;
              auVar95 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_570.hit + 0x80));
              *(undefined1 (*) [32])(local_570.ray + 0x200) = auVar95;
              auVar95 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_570.hit + 0xa0));
              *(undefined1 (*) [32])(local_570.ray + 0x220) = auVar95;
              auVar95 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_570.hit + 0xc0));
              *(undefined1 (*) [32])(local_570.ray + 0x240) = auVar95;
              auVar95 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_570.hit + 0xe0));
              *(undefined1 (*) [32])(local_570.ray + 0x260) = auVar95;
              auVar95 = vpmaskmovd_avx2(auVar99,*(undefined1 (*) [32])(local_570.hit + 0x100));
              *(undefined1 (*) [32])(local_570.ray + 0x280) = auVar95;
              goto LAB_0123f8ae;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar168;
        }
      }
    }
    goto LAB_0123f8ae;
  }
  local_420 = vinsertps_avx(auVar19,ZEXT416((uint)fVar100),0x10);
  auVar82 = vinsertps_avx(auVar202,ZEXT416((uint)auVar203._0_4_),0x10);
  goto LAB_0123f2fd;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }